

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int server_handle_hello(ptls_t *tls,ptls_message_emitter_t *emitter,ptls_iovec_t message,
                       ptls_handshake_properties_t *properties)

{
  undefined8 *puVar1;
  ptls_esni_secret_t **esni;
  ushort *end;
  uint8_t uVar2;
  uint16_t uVar3;
  en_ptls_state_t eVar4;
  uint32_t uVar5;
  st_ptls_on_extension_t *psVar6;
  char *pcVar7;
  ptls_esni_context_t *ppVar8;
  ptls_hash_algorithm_t *hash;
  st_ptls_encrypt_ticket_t *psVar9;
  ptls_key_exchange_algorithm_t *ppVar10;
  ptls_key_exchange_algorithm_t *negotiated_group;
  st_ptls_update_esni_key_t *psVar11;
  ptls_esni_secret_t *ppVar12;
  st_ptls_update_traffic_key_t *psVar13;
  char *__s;
  st_ptls_get_time_t *psVar14;
  st_ptls_hash_context_t *psVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  ptls_aead_algorithm_t *ppVar19;
  ptls_iovec_t ikm;
  ptls_iovec_t pVar20;
  ptls_iovec_t pubkey_00;
  ptls_iovec_t tbs;
  byte bVar21;
  undefined8 uVar22;
  ushort uVar23;
  ushort uVar24;
  short sVar25;
  short sVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  uint uVar30;
  ushort *puVar31;
  ushort *puVar32;
  size_t sVar33;
  ptls_key_schedule_t *ppVar34;
  uint64_t uVar35;
  ptls_key_exchange_algorithm_t **pppVar36;
  ushort *puVar37;
  uint8_t *puVar38;
  ptls_cipher_suite_t *output;
  st_ptls_extension_bitmap_t sVar39;
  st_ptls_hash_context_t *psVar40;
  ptls_context_t *ppVar41;
  ulong uVar42;
  ushort *puVar43;
  uint8_t *puVar44;
  ulong uVar45;
  long lVar46;
  size_t sVar47;
  uint8_t *puVar48;
  size_t *psVar49;
  long lVar50;
  anon_struct_176_2_4ca0e81c_for_traffic_protection *secret;
  size_t sVar51;
  ushort *puVar52;
  ptls_cipher_suite_t **pppVar53;
  long lVar54;
  uint8_t *puVar55;
  ptls_buffer_t *ppVar56;
  uint16_t *puVar57;
  ptls_cipher_suite_t *ppVar58;
  size_t sVar59;
  ptls_buffer_t *_buf;
  uint8_t *puVar60;
  ushort *puVar61;
  byte *pbVar62;
  uint8_t end_00 [8];
  ptls_buffer_t *ppVar63;
  size_t sVar64;
  size_t sVar65;
  bool bVar66;
  bool bVar67;
  ptls_iovec_t pVar68;
  ptls_iovec_t tbs_00;
  ptls_iovec_t pVar69;
  ptls_iovec_t pVar70;
  ptls_iovec_t pVar71;
  ptls_iovec_t ikm_00;
  ptls_iovec_t x;
  ptls_iovec_t x_00;
  ptls_buffer_t *local_7f0;
  ptls_cipher_suite_t *local_7e8;
  size_t local_7e0;
  ptls_esni_context_t **local_7d8;
  ptls_aead_context_t *local_7d0;
  ptls_cipher_suite_t *local_7c0;
  size_t local_7b8;
  uint16_t ticket_key_exchange_id;
  uint16_t ticket_csid;
  undefined1 local_7ac;
  undefined1 local_7ab;
  undefined1 local_7aa;
  undefined1 local_7a9;
  undefined1 local_7a8;
  undefined1 local_7a7;
  undefined1 local_7a6;
  undefined1 local_7a5;
  undefined1 local_7a4;
  undefined1 local_7a3;
  undefined1 local_7a2;
  undefined1 local_7a1;
  ptls_esni_secret_t *local_7a0;
  uint8_t binder_key [64];
  uint32_t age_add;
  undefined2 local_74a;
  undefined2 local_748;
  undefined2 local_746;
  undefined2 local_744;
  undefined2 local_742;
  ushort local_740 [3];
  ushort local_73a;
  ushort local_738 [3];
  ushort local_732;
  ushort local_730 [3];
  ushort local_72a;
  ushort local_728 [4];
  ushort local_720;
  ushort local_71e [3];
  ushort local_718 [3];
  ushort local_712;
  ushort local_710 [3];
  ushort local_70a;
  ptls_iovec_t ecdh_secret;
  anon_struct_24_2_cc7b932a key_share;
  uint64_t issue_at;
  ptls_iovec_t ticket_server_name;
  ptls_iovec_t pubkey;
  ptls_iovec_t ticket_negotiated_protocol;
  ptls_iovec_t ticket_psk;
  ptls_buffer_t decbuf;
  st_ptls_extension_bitmap_t bitmap;
  st_ptls_client_hello_t ch;
  ptls_cipher_suite_t *cs;
  ulong uStack_130;
  uint8_t *local_128;
  uint8_t *puStack_120;
  ptls_iovec_t *local_118;
  size_t local_110;
  st_ptls_signature_algorithms_t *local_108;
  size_t local_100;
  anon_struct_40_2_1fc0efb2_for_cert_compression_algos *local_f8;
  size_t local_f0;
  anon_struct_72_2_ef834970_for_client_ciphers *local_e8;
  size_t local_e0;
  byte local_d8;
  
  puVar38 = (uint8_t *)message.len;
  puVar48 = message.base;
  memset(&ch,0,0x4e8);
  ch.unknown_extensions[0].type = 0xffff;
  key_share.algorithm = (ptls_key_exchange_algorithm_t *)0x0;
  key_share.peer_key.base = (uint8_t *)0x0;
  key_share.peer_key.len = 0;
  pubkey.base = (uint8_t *)0x0;
  pubkey.len = 0;
  ecdh_secret.base = (uint8_t *)0x0;
  ecdh_secret.len = 0;
  iVar28 = 0x32;
  if ((long)puVar38 < 6) goto LAB_0011260a;
  if ((ushort)(*(ushort *)(puVar48 + 4) << 8 | *(ushort *)(puVar48 + 4) >> 8) == 0x303) {
    puVar37 = (ushort *)(puVar48 + (long)puVar38);
    if ((uint8_t *)0x25 < puVar38) {
      eVar4 = tls->state;
      ch.random_bytes = puVar48 + 6;
      if ((puVar38 != (uint8_t *)0x26) &&
         (puVar44 = (uint8_t *)(ulong)puVar48[0x26],
         puVar44 <= puVar38 + -0x27 && puVar44 < (uint8_t *)0x21)) {
        ch.legacy_session_id.base = puVar48 + 0x27;
        ch.legacy_session_id.len = (size_t)puVar44;
        if (1 < (ulong)((long)puVar37 - (long)(puVar48 + (long)(puVar44 + 0x27)))) {
          uVar23 = *(ushort *)(puVar48 + (long)(puVar44 + 0x27));
          uVar42 = (ulong)(ushort)(uVar23 << 8 | uVar23 >> 8);
          puVar60 = puVar48 + (long)(puVar44 + 0x29);
          if (uVar42 <= (ulong)((long)puVar37 - (long)puVar60)) {
            ch.cipher_suites.base = puVar60;
            puVar61 = (ushort *)(puVar60 + uVar42);
            ch.cipher_suites.len = uVar42;
            sVar51 = 1;
            uVar45 = 0x200;
            do {
              if ((long)uVar42 < 2) goto LAB_0011260a;
              *(ushort *)((long)ch.signature_algorithms.list + (uVar45 - 0x60)) =
                   *(ushort *)(puVar48 + (long)(puVar44 + (uVar45 - 0x1d7))) << 8 |
                   *(ushort *)(puVar48 + (long)(puVar44 + (uVar45 - 0x1d7))) >> 8;
              ch.client_ciphers.count = sVar51;
              if (0x23d < uVar45) break;
              lVar46 = uVar45 - 0x1d5;
              sVar51 = sVar51 + 1;
              uVar42 = uVar42 - 2;
              uVar45 = uVar45 + 2;
            } while ((ushort *)(puVar48 + (long)(puVar44 + lVar46)) != puVar61);
            if (puVar61 != puVar37) {
              uVar42 = (ulong)(byte)*puVar61;
              pbVar62 = (byte *)((long)puVar61 + 1);
              if (uVar42 <= (ulong)((long)puVar37 - (long)pbVar62) && uVar42 != 0) {
                ch.compression_methods.ids = pbVar62;
                puVar61 = (ushort *)(pbVar62 + uVar42);
                bitmap.bits[0] = '\0';
                bitmap.bits[1] = '\0';
                bitmap.bits[2] = '\0';
                bitmap.bits[3] = '\0';
                bitmap.bits[4] = '\0';
                bitmap.bits[5] = '\0';
                bitmap.bits[6] = '\0';
                bitmap.bits[7] = '\0';
                ch.compression_methods.count = uVar42;
                if (1 < (ulong)((long)puVar37 - (long)puVar61)) {
                  uVar42 = (ulong)(ushort)(*puVar61 << 8 | *puVar61 >> 8);
                  binder_key._0_8_ = puVar61 + 1;
                  if (uVar42 <= (ulong)((long)puVar37 - binder_key._0_8_)) {
                    puVar43 = (ushort *)(uVar42 + binder_key._0_8_);
                    uVar23 = 0;
                    iVar29 = 0x32;
                    puVar61 = (ushort *)binder_key._0_8_;
LAB_001119bd:
                    binder_key._0_8_ = puVar61;
                    if (puVar61 == puVar43) {
                      if (puVar43 != puVar37) goto LAB_001122a5;
                      iVar28 = is_supported_version(ch.selected_version);
                      ppVar58 = ch.esni.cipher;
                      puVar44 = ch.random_bytes;
                      if (iVar28 == 0) {
                        iVar28 = 0x46;
                        goto LAB_0011260a;
                      }
                      iVar28 = 0x2f;
                      if (((ch.compression_methods.count != 1) ||
                          (*ch.compression_methods.ids != '\0')) ||
                         ((ch.esni.cipher != (ptls_cipher_suite_t *)0x0 &&
                          (ch.key_shares.base == (uint8_t *)0x0)))) goto LAB_0011260a;
                      if (ch.psk.hash_end == (uint8_t *)0x0) {
                        if (ch.psk.early_data_indication != 0) goto LAB_0011260a;
                      }
                      else if (uVar23 != 0x29) goto LAB_0011260a;
                      ppVar41 = tls->ctx;
                      if ((ppVar41->field_0x70 & 1) != 0) {
                        ch.psk.ke_modes = ch.psk.ke_modes & 0xfffffffe;
                      }
                      if (eVar4 != PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) {
                        uVar16 = *(undefined8 *)ch.random_bytes;
                        uVar17 = *(undefined8 *)(ch.random_bytes + 8);
                        uVar18 = *(undefined8 *)(ch.random_bytes + 0x18);
                        *(undefined8 *)(tls->client_random + 0x10) =
                             *(undefined8 *)(ch.random_bytes + 0x10);
                        *(undefined8 *)(tls->client_random + 0x18) = uVar18;
                        *(undefined8 *)tls->client_random = uVar16;
                        *(undefined8 *)(tls->client_random + 8) = uVar17;
                        if (ch.legacy_session_id.len != 0) {
                          tls->field_0x160 = tls->field_0x160 | 4;
                        }
                        if ((ch.esni.cipher != (ptls_cipher_suite_t *)0x0) &&
                           (ppVar41->esni != (ptls_esni_context_t **)0x0)) {
                          binder_key[0] = '\0';
                          binder_key[1] = '\0';
                          binder_key[2] = '\0';
                          binder_key[3] = '\0';
                          binder_key[4] = '\0';
                          binder_key[5] = '\0';
                          binder_key[6] = '\0';
                          binder_key[7] = '\0';
                          if (tls->esni != (ptls_esni_secret_t *)0x0) {
                            __assert_fail("*secret == NULL",
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/lib/picotls.c"
                                          ,0xbcd,
                                          "int client_hello_decrypt_esni(ptls_context_t *, ptls_iovec_t *, ptls_esni_secret_t **, struct st_ptls_client_hello_t *)"
                                         );
                          }
                          esni = &tls->esni;
                          local_7a0 = (ptls_esni_secret_t *)calloc(1,0xd0);
                          puVar60 = ch.esni.record_digest;
                          *esni = local_7a0;
                          if (local_7a0 == (ptls_esni_secret_t *)0x0) goto LAB_0011358b;
                          local_7d8 = ppVar41->esni;
                          iVar28 = 0x2f;
                          goto LAB_0011246f;
                        }
                        bVar67 = true;
                        local_7e8 = (ptls_cipher_suite_t *)ch.server_name.base;
                        if (ch.server_name.base == (uint8_t *)0x0) {
                          local_7e8 = (ptls_cipher_suite_t *)0x0;
                          local_7f0 = (ptls_buffer_t *)0x0;
                        }
                        else {
                          local_7f0 = (ptls_buffer_t *)ch.server_name.len;
                        }
                        local_7e0._0_1_ = '\0';
                        goto LAB_00112515;
                      }
                      if (ch.psk.early_data_indication != 0) goto LAB_001122a5;
                      iVar29 = (*ptls_mem_equal)(tls->client_random,ch.random_bytes,0x20);
                      iVar28 = 0x28;
                      if ((iVar29 != 0) &&
                         ((pcVar7 = tls->server_name, pcVar7 == (char *)0x0 ||
                          ((sVar33 = strlen(pcVar7), ch.server_name.len == sVar33 &&
                           (iVar29 = bcmp(ch.server_name.base,pcVar7,sVar33), iVar29 == 0))))))
                      goto LAB_001125c2;
                      goto LAB_0011260a;
                    }
                    iVar28 = iVar29;
                    if ((long)puVar43 - (long)puVar61 < 2) goto LAB_0011260a;
                    uVar23 = *puVar61 << 8 | *puVar61 >> 8;
                    puVar32 = puVar61 + 1;
                    binder_key._0_8_ = puVar32;
                    if ((uVar23 < 0x40) && ((bitmap.bits[uVar23 >> 3] >> (uVar23 & 7) & 1) != 0)) {
LAB_00112299:
                      iVar28 = 0x2f;
                      goto LAB_0011260a;
                    }
                    extension_bitmap_set(&bitmap,uVar23);
                    if ((ulong)((long)puVar43 - (long)puVar32) < 2) goto LAB_0011260a;
                    uVar24 = puVar61[1] << 8 | puVar61[1] >> 8;
                    uVar42 = (ulong)uVar24;
                    puVar32 = puVar61 + 2;
                    binder_key._0_8_ = puVar32;
                    if ((ulong)((long)puVar43 - (long)puVar32) < uVar42) goto LAB_0011260a;
                    psVar6 = tls->ctx->on_extension;
                    if ((psVar6 != (st_ptls_on_extension_t *)0x0) &&
                       (pVar69.len._0_2_ = uVar24, pVar69.base = (uint8_t *)puVar32,
                       pVar69.len._2_6_ = 0, iVar27 = (*psVar6->cb)(psVar6,tls,'\x01',uVar23,pVar69)
                       , iVar27 != 0)) {
                      iVar28 = 1;
                      goto LAB_0011260a;
                    }
                    end = (ushort *)((long)puVar32 + uVar42);
                    switch(uVar23) {
                    case 0x29:
                      if (uVar24 < 2) goto LAB_0011260a;
                      uVar42 = (ulong)(ushort)(puVar61[2] << 8 | puVar61[2] >> 8);
                      binder_key._0_8_ = puVar61 + 3;
                      if ((ulong)((long)end - binder_key._0_8_) < uVar42) goto LAB_0011260a;
                      pbVar62 = (byte *)(uVar42 + binder_key._0_8_);
                      lVar46 = 1;
                      do {
                        local_7e8 = (ptls_cipher_suite_t *)lVar46;
                        local_128 = (uint8_t *)0x0;
                        puStack_120 = (uint8_t *)0x0;
                        local_118 = (ptls_iovec_t *)0x0;
                        cs = (ptls_cipher_suite_t *)0x0;
                        uStack_130 = 0;
                        iVar28 = iVar29;
                        if ((ulong)((long)pbVar62 - binder_key._0_8_) < 2) goto LAB_0011260a;
                        uVar42 = (ulong)(ushort)(*(ushort *)binder_key._0_8_ << 8 |
                                                *(ushort *)binder_key._0_8_ >> 8);
                        ppVar58 = (ptls_cipher_suite_t *)(binder_key._0_8_ + 2);
                        if ((ulong)((long)pbVar62 - (long)ppVar58) < uVar42) goto LAB_0011260a;
                        binder_key._0_8_ = (long)&ppVar58->id + uVar42;
                        cs = ppVar58;
                        uStack_130 = uVar42;
                        iVar28 = ptls_decode32((uint32_t *)&local_128,(uint8_t **)binder_key,pbVar62
                                              );
                        sVar51 = ch.psk.identities.count;
                        if (iVar28 != 0) goto LAB_0011260a;
                        if (ch.psk.identities.count < 4) {
                          ch.psk.identities.count = ch.psk.identities.count + 1;
                          ch.psk.identities.list[sVar51].binder.len = (size_t)local_118;
                          *(uint8_t **)&ch.psk.identities.list[sVar51].obfuscated_ticket_age =
                               local_128;
                          ch.psk.identities.list[sVar51].binder.base = puStack_120;
                          ch.psk.identities.list[sVar51].identity.base = (uint8_t *)cs;
                          ch.psk.identities.list[sVar51].identity.len = uStack_130;
                        }
                        sVar51 = ch.psk.identities.count;
                        lVar46 = (long)local_7e8 + 1;
                      } while ((byte *)binder_key._0_8_ != pbVar62);
                      ch.psk.hash_end = (uint8_t *)binder_key._0_8_;
                      iVar28 = iVar29;
                      if ((ulong)((long)end - (long)pbVar62) < 2) goto LAB_0011260a;
                      uVar42 = (ulong)(ushort)(*(ushort *)binder_key._0_8_ << 8 |
                                              *(ushort *)binder_key._0_8_ >> 8);
                      puVar61 = (ushort *)(binder_key._0_8_ + 2);
                      if ((ulong)((long)end - (long)puVar61) < uVar42) goto LAB_0011260a;
                      puVar32 = (ushort *)(uVar42 + (long)puVar61);
                      psVar49 = &ch.psk.identities.list[0].binder.len;
                      uVar42 = 0;
                      do {
                        if (puVar32 == puVar61) goto LAB_0011260a;
                        uVar45 = (ulong)(byte)*puVar61;
                        pbVar62 = (byte *)((long)puVar61 + 1);
                        if ((ulong)((long)puVar32 - (long)pbVar62) < uVar45) goto LAB_0011260a;
                        if (uVar42 < sVar51) {
                          ((ptls_iovec_t *)(psVar49 + -1))->base = pbVar62;
                          *psVar49 = uVar45;
                        }
                        puVar61 = (ushort *)(pbVar62 + uVar45);
                        uVar42 = uVar42 + 1;
                        local_7e8 = (ptls_cipher_suite_t *)((long)local_7e8 + -1);
                        psVar49 = psVar49 + 5;
                      } while (puVar61 != puVar32);
                      if (local_7e8 != (ptls_cipher_suite_t *)0x0) goto LAB_00112299;
                      break;
                    case 0x2a:
                      ch.psk.early_data_indication = 1;
                      puVar61 = end;
                      goto LAB_001119bd;
                    case 0x2b:
                      if (uVar42 == 0) goto LAB_0011260a;
                      binder_key._0_8_ = (long)puVar61 + 5;
                      if ((ulong)((long)end - binder_key._0_8_) < (ulong)(byte)puVar61[2])
                      goto LAB_0011260a;
                      puVar32 = (ushort *)((ulong)(byte)puVar61[2] + binder_key._0_8_);
                      puVar61 = (ushort *)binder_key._0_8_;
                      lVar46 = 4;
                      do {
                        if ((long)puVar32 - (long)puVar61 < 2) goto LAB_0011260a;
                        uVar24 = *puVar61;
                        puVar61 = puVar61 + 1;
                        lVar54 = 0;
                        for (puVar57 = supported_versions;
                            (lVar50 = lVar46, lVar46 != lVar54 &&
                            (lVar50 = lVar54, *puVar57 != (uint16_t)(uVar24 << 8 | uVar24 >> 8)));
                            puVar57 = puVar57 + 1) {
                          lVar54 = lVar54 + 1;
                        }
                        lVar46 = lVar50;
                      } while (puVar61 != puVar32);
                      binder_key._0_8_ = puVar32;
                      if (lVar50 != 4) {
                        ch.selected_version = supported_versions[lVar50];
                      }
                      break;
                    case 0x2c:
                      if ((properties == (ptls_handshake_properties_t *)0x0) ||
                         ((properties->field_0).server.cookie.key == (void *)0x0))
                      goto LAB_00112299;
                      ch.cookie.all.base = (uint8_t *)puVar32;
                      ch.cookie.all.len = uVar42;
                      if (1 < uVar42) {
                        uVar42 = (ulong)(ushort)(puVar61[2] << 8 | puVar61[2] >> 8);
                        puVar32 = puVar61 + 3;
                        binder_key._0_8_ = puVar32;
                        if ((uVar42 <= (ulong)((long)end - (long)puVar32)) &&
                           (ch.cookie.tbs.base = (uint8_t *)puVar32, 1 < uVar42)) {
                          puVar31 = (ushort *)(uVar42 + (long)puVar32);
                          uVar42 = (ulong)(ushort)(puVar61[3] << 8 | puVar61[3] >> 8);
                          if ((uVar42 <= (ulong)((long)puVar31 - (long)(puVar61 + 4))) &&
                             (uVar42 != 0)) {
                            puVar52 = (ushort *)((long)(puVar61 + 4) + uVar42);
                            binder_key._0_8_ = (long)puVar61 + 9;
                            uVar42 = (ulong)(byte)puVar61[4];
                            if (uVar42 <= (ulong)((long)puVar52 - binder_key._0_8_)) {
                              ch.cookie.ch1_hash.base = (uint8_t *)binder_key._0_8_;
                              puVar61 = (ushort *)(binder_key._0_8_ + uVar42);
                              ch.cookie.ch1_hash.len = uVar42;
                              if (puVar61 != puVar52) {
                                binder_key._0_8_ = (long)puVar61 + 1;
                                if ((byte)*puVar61 == 1) {
                                  ch.cookie._64_1_ = ch.cookie._64_1_ | 1;
                                }
                                else {
                                  if ((byte)*puVar61 != 0) goto LAB_0011260a;
                                  if ((ch.cookie._64_1_ & 1) != 0) {
                                    __assert_fail("!ch->cookie.sent_key_share",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/lib/picotls.c"
                                                  ,0xd05,
                                                  "int decode_client_hello(ptls_t *, struct st_ptls_client_hello_t *, const uint8_t *, const uint8_t *const, ptls_handshake_properties_t *)"
                                                 );
                                  }
                                }
                                if (((ushort *)binder_key._0_8_ == puVar52) &&
                                   (ch.cookie.tbs.len = (long)puVar52 - (long)puVar32,
                                   puVar31 != puVar52)) {
                                  binder_key._0_8_ = puVar61 + 1;
                                  uVar42 = (ulong)(byte)*puVar52;
                                  if (uVar42 <= (ulong)((long)puVar31 - binder_key._0_8_)) {
                                    ch.cookie.signature.base = (uint8_t *)binder_key._0_8_;
                                    puVar61 = (ushort *)(binder_key._0_8_ + uVar42);
                                    ch.cookie.signature.len = uVar42;
                                    if (puVar61 == puVar31) goto LAB_0011227c;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                      goto LAB_0011260a;
                    case 0x2d:
                      if (uVar42 != 0) {
                        pbVar62 = (byte *)((long)puVar61 + 5);
                        uVar42 = (ulong)(byte)puVar61[2];
                        binder_key._0_8_ = pbVar62;
                        if ((uVar42 <= (ulong)((long)end - (long)pbVar62)) && (uVar42 != 0)) {
                          puVar61 = (ushort *)(pbVar62 + uVar42);
                          uVar30 = ch.psk.ke_modes;
                          for (uVar45 = 0; binder_key._0_8_ = puVar61, uVar42 != uVar45;
                              uVar45 = uVar45 + 1) {
                            if (pbVar62[uVar45] < 0x20) {
                              uVar30 = uVar30 | 1 << (pbVar62[uVar45] & 0x1f);
                              ch.psk.ke_modes = uVar30;
                            }
                          }
LAB_0011227c:
                          bVar67 = puVar61 == end;
                          goto LAB_0011227f;
                        }
                      }
                      goto LAB_0011260a;
                    case 0x2e:
                    case 0x2f:
                    case 0x30:
                    case 0x31:
                    case 0x32:
switchD_00111b43_caseD_2e:
                      handle_unknown_extension
                                (tls,properties,uVar23,(uint8_t *)puVar32,(uint8_t *)end,
                                 ch.unknown_extensions);
                      puVar61 = end;
                      goto LAB_001119bd;
                    case 0x33:
                      ch.key_shares.base = (uint8_t *)puVar32;
                      ch.key_shares.len = uVar42;
                      puVar61 = end;
                      goto LAB_001119bd;
                    default:
                      if (uVar23 != 0xffce) {
                        if (uVar23 == 5) {
                          ch._1248_1_ = ch._1248_1_ | 1;
                          puVar61 = end;
                        }
                        else {
                          if (uVar23 != 10) {
                            if (uVar23 == 0xd) goto LAB_00111f63;
                            if (uVar23 == 0x10) {
                              if (1 < uVar24) {
                                uVar42 = (ulong)(ushort)(puVar61[2] << 8 | puVar61[2] >> 8);
                                binder_key._0_8_ = puVar61 + 3;
                                if (uVar42 <= (ulong)((long)end - binder_key._0_8_)) {
                                  puVar32 = (ushort *)(uVar42 + binder_key._0_8_);
                                  sVar51 = ch.alpn.count;
                                  puVar61 = (ushort *)binder_key._0_8_;
                                  do {
                                    if (puVar32 == puVar61) goto LAB_0011260a;
                                    uVar42 = (ulong)(byte)*puVar61;
                                    pbVar62 = (byte *)((long)puVar61 + 1);
                                    if (((ulong)((long)puVar32 - (long)pbVar62) < uVar42) ||
                                       (uVar42 == 0)) goto LAB_0011260a;
                                    uVar45 = sVar51;
                                    if (sVar51 < 0x10) {
                                      uVar45 = sVar51 + 1;
                                      ch.alpn.count = uVar45;
                                      ch.alpn.list[sVar51].base = pbVar62;
                                      ch.alpn.list[sVar51].len = uVar42;
                                    }
                                    puVar61 = (ushort *)(pbVar62 + uVar42);
                                    sVar51 = uVar45;
                                  } while (puVar61 != puVar32);
                                  break;
                                }
                              }
                            }
                            else if (uVar23 == 0x1b) {
                              if (uVar42 != 0) {
                                binder_key._0_8_ = (long)puVar61 + 5;
                                uVar42 = (ulong)(byte)puVar61[2];
                                if (uVar42 <= (ulong)((long)end - binder_key._0_8_)) {
                                  puVar32 = (ushort *)(binder_key._0_8_ + uVar42);
                                  puVar61 = puVar61 + 3;
                                  sVar51 = ch.cert_compression_algos.count;
                                  do {
                                    if ((long)uVar42 < 2) goto LAB_0011260a;
                                    uVar45 = sVar51;
                                    if (sVar51 < 0x10) {
                                      uVar45 = sVar51 + 1;
                                      ch.cert_compression_algos.count = uVar45;
                                      ch.cert_compression_algos.list[sVar51] =
                                           *(ushort *)((long)puVar61 + -1) << 8 |
                                           *(ushort *)((long)puVar61 + -1) >> 8;
                                    }
                                    puVar61 = puVar61 + 1;
                                    uVar42 = uVar42 - 2;
                                    sVar51 = uVar45;
                                  } while (uVar42 != 0);
                                  break;
                                }
                              }
                            }
                            else {
                              if (uVar23 != 0) goto switchD_00111b43_caseD_2e;
                              iVar28 = client_hello_decode_server_name
                                                 (&ch.server_name,(uint8_t **)binder_key,
                                                  (uint8_t *)end);
                              if (iVar28 == 0) {
                                bVar67 = (ushort *)binder_key._0_8_ == end;
                                goto LAB_0011227f;
                              }
                            }
                            goto LAB_0011260a;
                          }
                          ch.negotiated_groups.base = (uint8_t *)puVar32;
                          ch.negotiated_groups.len = uVar42;
                          puVar61 = end;
                        }
                        goto LAB_001119bd;
                      }
                      if (ch.esni.cipher == (ptls_cipher_suite_t *)0x0) {
                        if (uVar24 < 2) goto LAB_0011260a;
                        binder_key._0_8_ = puVar61 + 3;
                        pppVar53 = tls->ctx->cipher_suites;
                        while( true ) {
                          if (*pppVar53 == (ptls_cipher_suite_t *)0x0) goto LAB_00112299;
                          if ((*pppVar53)->id == (uint16_t)(puVar61[2] << 8 | puVar61[2] >> 8))
                          break;
                          pppVar53 = pppVar53 + 1;
                        }
                        iVar28 = select_key_share(&ch.esni.key_share,&ch.esni.peer_key,
                                                  tls->ctx->key_exchanges,(uint8_t **)binder_key,
                                                  (uint8_t *)end,1);
                        if ((iVar28 != 0) ||
                           (iVar28 = iVar29, (ulong)((long)end - binder_key._0_8_) < 2))
                        goto LAB_0011260a;
                        uVar42 = (ulong)(ushort)(*(ushort *)binder_key._0_8_ << 8 |
                                                *(ushort *)binder_key._0_8_ >> 8);
                        puVar44 = (uint8_t *)(binder_key._0_8_ + 2);
                        if ((ulong)((long)end - (long)puVar44) < uVar42) goto LAB_0011260a;
                        if (uVar42 != (*pppVar53)->hash->digest_size) goto LAB_00112299;
                        puVar61 = (ushort *)(puVar44 + uVar42);
                        ch.esni.record_digest = puVar44;
                        if ((ulong)((long)end - (long)puVar61) < 2) goto LAB_0011260a;
                        uVar42 = (ulong)(ushort)(*puVar61 << 8 | *puVar61 >> 8);
                        puVar61 = puVar61 + 1;
                        if ((ulong)((long)end - (long)puVar61) < uVar42) goto LAB_0011260a;
                        if ((*pppVar53)->aead->tag_size <= uVar42) {
                          ch.esni.encrypted_sni.base = (uint8_t *)puVar61;
                          ch.esni.encrypted_sni.len = uVar42;
                          if ((ushort *)((long)puVar61 + uVar42) != end) goto LAB_0011260a;
                          ch.esni.cipher = *pppVar53;
                          puVar61 = end;
                          goto LAB_001119bd;
                        }
                      }
                      goto LAB_00112299;
                    }
                    bVar67 = puVar32 == end;
LAB_0011227f:
                    puVar61 = end;
                    iVar28 = iVar29;
                    if (!bVar67) goto LAB_0011260a;
                    goto LAB_001119bd;
                  }
                }
              }
            }
          }
        }
      }
    }
    goto LAB_0011260a;
  }
  goto LAB_00112607;
LAB_0011246f:
  ppVar8 = *local_7d8;
  if (ppVar8 == (ptls_esni_context_t *)0x0) goto LAB_0011390f;
  puVar55 = ppVar8->cipher_suites[-1].record_digest;
  do {
    puVar1 = (undefined8 *)(puVar55 + 0x40);
    if ((uint16_t *)*puVar1 == (uint16_t *)0x0) goto LAB_0011390f;
    puVar55 = puVar55 + 0x48;
  } while (*(uint16_t *)*puVar1 != ppVar58->id);
  hash = ppVar58->hash;
  iVar29 = bcmp(puVar55,puVar60,hash->digest_size);
  if (iVar29 == 0) {
    local_7a0->version = ppVar8->version;
    local_7d0 = (ptls_aead_context_t *)ppVar8->key_exchanges;
    goto LAB_00113123;
  }
  local_7d8 = local_7d8 + 1;
  goto LAB_0011246f;
LAB_00113123:
  if (*(st_ptls_key_exchange_context_t **)local_7d0 == (st_ptls_key_exchange_context_t *)0x0)
  goto LAB_0011390f;
  uVar3 = (*(st_ptls_key_exchange_context_t **)local_7d0)->algo->id;
  if (uVar3 == (ch.esni.key_share)->id) {
    puVar55 = local_7a0->esni_contents_hash;
    pubkey_00.len = ch.esni.peer_key.len;
    pubkey_00.base = ch.esni.peer_key.base;
    local_7a0 = (ptls_esni_secret_t *)ch.esni.peer_key.len;
    iVar29 = build_esni_contents_hash(hash,puVar55,puVar60,uVar3,pubkey_00,puVar44);
    if ((iVar29 != 0) ||
       (pVar68.len = (size_t)local_7a0, pVar68.base = ch.esni.peer_key.base,
       iVar29 = (*(*(st_ptls_key_exchange_context_t **)local_7d0)->on_exchange)
                          ((st_ptls_key_exchange_context_t **)local_7d0,0,&(*esni)->secret,pVar68),
       iVar29 != 0)) {
      local_7e8 = (ptls_cipher_suite_t *)0x0;
      local_7f0 = (ptls_buffer_t *)0x0;
      local_7d0 = (ptls_aead_context_t *)0x0;
      local_7c0 = (ptls_cipher_suite_t *)0x0;
      iVar28 = iVar29;
      goto LAB_0011392a;
    }
    sVar33 = ch.esni.encrypted_sni.len - ppVar58->aead->tag_size;
    local_7e8 = (ptls_cipher_suite_t *)0x0;
    local_7f0 = (ptls_buffer_t *)0x0;
    local_7d0 = (ptls_aead_context_t *)0x0;
    local_7c0 = (ptls_cipher_suite_t *)0x0;
    if (sVar33 != (ulong)(*local_7d8)->padded_length + 0x10) goto LAB_0011392a;
    output = (ptls_cipher_suite_t *)malloc(sVar33);
    if (output != (ptls_cipher_suite_t *)0x0) {
      local_7e8 = (ptls_cipher_suite_t *)0x0;
      iVar28 = create_esni_aead((ptls_aead_context_t **)binder_key,0,ppVar58,(*esni)->secret,
                                (*esni)->esni_contents_hash);
      uVar16 = binder_key._0_8_;
      local_7d0 = (ptls_aead_context_t *)binder_key._0_8_;
      local_7c0 = output;
      if (iVar28 != 0) {
        local_7f0 = (ptls_buffer_t *)0x0;
        goto LAB_0011392a;
      }
      local_7e8 = (ptls_cipher_suite_t *)0x0;
      sVar51 = ptls_aead_decrypt((ptls_aead_context_t *)binder_key._0_8_,output,
                                 ch.esni.encrypted_sni.base,ch.esni.encrypted_sni.len,0,
                                 ch.key_shares.base,ch.key_shares.len);
      if (sVar51 != (ulong)(*local_7d8)->padded_length + 0x10) {
        local_7f0 = (ptls_buffer_t *)0x0;
        iVar28 = 0x33;
        goto LAB_0011392a;
      }
      ptls_aead_free((ptls_aead_context_t *)uVar16);
      if ((ulong)(*local_7d8)->padded_length < 0x10) goto LAB_00113a75;
      end_00 = (uint8_t  [8])((long)&output->id + (ulong)(*local_7d8)->padded_length);
      ppVar12 = *esni;
      ppVar19 = output->aead;
      *(undefined8 *)ppVar12->nonce = *(undefined8 *)output;
      *(ptls_aead_algorithm_t **)(ppVar12->nonce + 8) = ppVar19;
      bitmap.bits = (uint8_t  [8])&output->hash;
      iVar28 = client_hello_decode_server_name
                         ((ptls_iovec_t *)&cs,(uint8_t **)&bitmap,(uint8_t *)end_00);
      sVar39.bits = bitmap.bits;
      if (iVar28 == 0) goto LAB_00113af2;
      goto LAB_00113aca;
    }
    iVar28 = 0x201;
    goto LAB_0011390f;
  }
  local_7d0 = (ptls_aead_context_t *)((long)local_7d0 + 8);
  goto LAB_00113123;
LAB_0011390f:
  local_7e8 = (ptls_cipher_suite_t *)0x0;
  local_7f0 = (ptls_buffer_t *)0x0;
  local_7d0 = (ptls_aead_context_t *)0x0;
  local_7c0 = (ptls_cipher_suite_t *)0x0;
  goto LAB_0011392a;
LAB_00111f63:
  iVar28 = decode_signature_algorithms
                     (&ch.signature_algorithms,(uint8_t **)binder_key,(uint8_t *)end);
  puVar61 = end;
  if (iVar28 != 0) goto LAB_0011260a;
  goto LAB_001119bd;
  while (uVar2 = *(uint8_t *)sVar39.bits, sVar39.bits = sVar39.bits + 1, uVar2 == '\0') {
LAB_00113af2:
    if (sVar39.bits == end_00) {
      local_7f0 = (ptls_buffer_t *)uStack_130;
      memmove(output,cs,uStack_130);
      local_7d0 = (ptls_aead_context_t *)0x0;
      local_7c0 = (ptls_cipher_suite_t *)0x0;
      iVar28 = 0;
      local_7e8 = output;
      goto LAB_0011392a;
    }
  }
LAB_00113a75:
  iVar28 = 0x2f;
LAB_00113aca:
  local_7e8 = (ptls_cipher_suite_t *)0x0;
  local_7f0 = (ptls_buffer_t *)0x0;
  local_7d0 = (ptls_aead_context_t *)0x0;
LAB_0011392a:
  free(local_7c0);
  if (local_7d0 != (ptls_aead_context_t *)0x0) {
    ptls_aead_free(local_7d0);
  }
  if (iVar28 != 0) {
    if (*esni != (ptls_esni_secret_t *)0x0) {
      free_esni_secret(esni,1);
    }
    goto LAB_0011260a;
  }
  ppVar41 = tls->ctx;
  psVar11 = ppVar41->update_esni_key;
  local_7e0._0_1_ = '\x01';
  if (psVar11 != (st_ptls_update_esni_key_t *)0x0) {
    iVar28 = (*psVar11->cb)(psVar11,tls,tls->esni->secret,(ch.esni.cipher)->hash,
                            tls->esni->esni_contents_hash);
    if (iVar28 != 0) goto LAB_0011260a;
    ppVar41 = tls->ctx;
  }
  bVar67 = false;
LAB_00112515:
  if (ppVar41->on_client_hello == (ptls_on_client_hello_t *)0x0) {
    iVar28 = 0;
  }
  else {
    cs = local_7e8;
    uStack_130 = (ulong)local_7f0;
    local_118 = ch.alpn.list;
    local_e8 = &ch.client_ciphers;
    local_110 = ch.alpn.count;
    local_108 = &ch.signature_algorithms;
    local_100 = ch.signature_algorithms.count;
    local_f8 = &ch.cert_compression_algos;
    local_f0 = ch.cert_compression_algos.count;
    local_e0 = ch.client_ciphers.count;
    local_d8 = (local_d8 & 0xfe) + (char)local_7e0;
    local_128 = puVar48;
    puStack_120 = puVar38;
    iVar28 = (*ppVar41->on_client_hello->cb)
                       (ppVar41->on_client_hello,tls,(ptls_on_client_hello_parameters_t *)&cs);
  }
  if (!bVar67) {
    free(local_7e8);
  }
  if (iVar28 != 0) goto LAB_0011260a;
LAB_001125c2:
  iVar28 = select_cipher(&cs,tls->ctx->cipher_suites,ch.cipher_suites.base,
                         ch.cipher_suites.base + ch.cipher_suites.len);
  if (iVar28 != 0) goto LAB_0011260a;
  if (eVar4 == PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) {
    if (tls->cipher_suite != cs) {
LAB_00112607:
      iVar28 = 0x28;
      goto LAB_0011260a;
    }
  }
  else {
    tls->cipher_suite = cs;
    ppVar34 = key_schedule_new(cs,(ptls_cipher_suite_t **)0x0,tls->ctx->hkdf_label_prefix__obsolete)
    ;
    tls->key_schedule = ppVar34;
  }
  sVar51 = ch.key_shares.len;
  puVar44 = ch.key_shares.base;
  if (ch.key_shares.base != (uint8_t *)0x0 &&
      key_share.algorithm == (ptls_key_exchange_algorithm_t *)0x0) {
    if (1 < ch.key_shares.len) {
      uVar42 = (ulong)(ushort)(*(ushort *)ch.key_shares.base << 8 |
                              *(ushort *)ch.key_shares.base >> 8);
      cs = (ptls_cipher_suite_t *)(ch.key_shares.base + 2);
      if (uVar42 <= ch.key_shares.len - 2) {
        ppVar58 = (ptls_cipher_suite_t *)(ch.key_shares.base + uVar42 + 2);
        iVar28 = select_key_share(&key_share.algorithm,&key_share.peer_key,tls->ctx->key_exchanges,
                                  (uint8_t **)&cs,(uint8_t *)ppVar58,0);
        if (((iVar28 != 0) || (iVar28 = 0x32, cs != ppVar58)) ||
           (iVar28 = 0x32, cs != (ptls_cipher_suite_t *)(puVar44 + sVar51))) goto LAB_0011260a;
        goto LAB_00112743;
      }
    }
LAB_001122a5:
    iVar28 = 0x32;
    goto LAB_0011260a;
  }
LAB_00112743:
  ppVar10 = key_share.algorithm;
  if (eVar4 != PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) {
    if (key_share.algorithm != (ptls_key_exchange_algorithm_t *)0x0 && ch.cookie.all.len != 0) {
      sVar51 = (*tls->ctx->cipher_suites)->hash->digest_size;
      tbs.len = ch.cookie.tbs.len;
      tbs.base = ch.cookie.tbs.base;
      iVar28 = calc_cookie_signature(tls,properties,key_share.algorithm,tbs,(uint8_t *)&cs);
      if (((iVar28 != 0) || (iVar28 = 0x28, ch.cookie.signature.len != sVar51)) ||
         (iVar29 = (*ptls_mem_equal)(ch.cookie.signature.base,&cs,sVar51), iVar29 == 0))
      goto LAB_0011260a;
      key_schedule_update_ch1hash_prefix(tls->key_schedule);
      ptls__key_schedule_update_hash
                (tls->key_schedule,ch.cookie.ch1_hash.base,ch.cookie.ch1_hash.len);
      key_schedule_extract(tls->key_schedule,(ptls_iovec_t)ZEXT816(0));
      sVar51 = emitter->buf->off;
      iVar28 = (*emitter->begin_message)(emitter);
      if (iVar28 != 0) goto LAB_0011260a;
      ppVar63 = emitter->buf;
      ppVar34 = tls->key_schedule;
      sVar59 = ppVar63->off;
      local_7a1 = 2;
      iVar28 = ptls_buffer__do_pushv(ppVar63,&local_7a1,1);
      if ((iVar28 != 0) || (iVar28 = ptls_buffer__do_pushv(ppVar63,"",3), iVar28 != 0))
      goto LAB_0011260a;
      local_7d0 = (ptls_aead_context_t *)ppVar63->off;
      local_70a = 0x303;
      iVar28 = ptls_buffer__do_pushv(emitter->buf,&local_70a,2);
      if ((iVar28 != 0) || (iVar28 = ptls_buffer_reserve(emitter->buf,0x20), iVar28 != 0))
      goto LAB_0011260a;
      puVar44 = emitter->buf->base;
      sVar64 = emitter->buf->off;
      puVar60 = puVar44 + sVar64 + 0x10;
      puVar60[0] = 0xc2;
      puVar60[1] = 0xa2;
      puVar60[2] = '\x11';
      puVar60[3] = '\x16';
      puVar60[4] = 'z';
      puVar60[5] = 0xbb;
      puVar60[6] = 0x8c;
      puVar60[7] = '^';
      puVar60[8] = '\a';
      puVar60[9] = 0x9e;
      puVar60[10] = '\t';
      puVar60[0xb] = 0xe2;
      puVar60[0xc] = 200;
      puVar60[0xd] = 0xa8;
      puVar60[0xe] = '3';
      puVar60[0xf] = 0x9c;
      puVar44 = puVar44 + sVar64;
      puVar44[0] = 0xcf;
      puVar44[1] = '!';
      puVar44[2] = 0xad;
      puVar44[3] = 't';
      puVar44[4] = 0xe5;
      puVar44[5] = 0x9a;
      puVar44[6] = 'a';
      puVar44[7] = '\x11';
      puVar44[8] = 0xbe;
      puVar44[9] = '\x1d';
      puVar44[10] = 0x8c;
      puVar44[0xb] = '\x02';
      puVar44[0xc] = '\x1e';
      puVar44[0xd] = 'e';
      puVar44[0xe] = 0xb8;
      puVar44[0xf] = 0x91;
      ppVar56 = emitter->buf;
      psVar49 = &ppVar56->off;
      *psVar49 = *psVar49 + 0x20;
      iVar28 = ptls_buffer__do_pushv(ppVar56,"",1);
      if (iVar28 != 0) goto LAB_0011260a;
      sVar64 = emitter->buf->off;
      iVar28 = ptls_buffer__do_pushv
                         (emitter->buf,ch.legacy_session_id.base,ch.legacy_session_id.len);
      if (iVar28 != 0) goto LAB_0011260a;
      emitter->buf->base[sVar64 - 1] = (char)(int)emitter->buf->off - (char)sVar64;
      uVar23 = tls->cipher_suite->id;
      local_710[2] = uVar23 << 8 | uVar23 >> 8;
      iVar28 = ptls_buffer__do_pushv(emitter->buf,local_710 + 2,2);
      if (iVar28 != 0) goto LAB_0011260a;
      local_7a2 = 0;
      iVar28 = ptls_buffer__do_pushv(emitter->buf,&local_7a2,1);
      if ((iVar28 != 0) || (iVar28 = ptls_buffer__do_pushv(emitter->buf,"",2), iVar28 != 0))
      goto LAB_0011260a;
      local_7c0 = (ptls_cipher_suite_t *)emitter->buf->off;
      local_710[1] = 0x2b00;
      iVar28 = ptls_buffer__do_pushv(emitter->buf,local_710 + 1,2);
      if ((iVar28 != 0) || (iVar28 = ptls_buffer__do_pushv(emitter->buf,"",2), iVar28 != 0))
      goto LAB_0011260a;
      local_7b8 = emitter->buf->off;
      local_710[0] = ch.selected_version << 8 | ch.selected_version >> 8;
      iVar28 = ptls_buffer__do_pushv(emitter->buf,local_710,2);
      if (iVar28 != 0) goto LAB_0011260a;
      uVar42 = emitter->buf->off - local_7b8;
      for (lVar46 = 8; lVar46 != -8; lVar46 = lVar46 + -8) {
        emitter->buf->base[local_7b8 - 2] = (uint8_t)(uVar42 >> ((byte)lVar46 & 0x3f));
        local_7b8 = local_7b8 + 1;
      }
      ppVar56 = emitter->buf;
      if ((ch.cookie._64_1_ & 1) != 0) {
        local_712 = 0x3300;
        iVar28 = ptls_buffer__do_pushv(ppVar56,&local_712,2);
        if ((iVar28 != 0) || (iVar28 = ptls_buffer__do_pushv(emitter->buf,"",2), iVar28 != 0))
        goto LAB_0011260a;
        local_7b8 = emitter->buf->off;
        local_718[2] = ppVar10->id << 8 | ppVar10->id >> 8;
        iVar28 = ptls_buffer__do_pushv(emitter->buf,local_718 + 2,2);
        if (iVar28 != 0) goto LAB_0011260a;
        uVar42 = emitter->buf->off - local_7b8;
        for (lVar46 = 8; lVar46 != -8; lVar46 = lVar46 + -8) {
          emitter->buf->base[local_7b8 - 2] = (uint8_t)(uVar42 >> ((byte)lVar46 & 0x3f));
          local_7b8 = local_7b8 + 1;
        }
        ppVar56 = emitter->buf;
      }
      local_718[1] = 0x2c00;
      iVar28 = ptls_buffer__do_pushv(ppVar56,local_718 + 1,2);
      if ((iVar28 != 0) || (iVar28 = ptls_buffer__do_pushv(emitter->buf,"",2), iVar28 != 0))
      goto LAB_0011260a;
      local_7e8 = (ptls_cipher_suite_t *)emitter->buf->off;
      iVar28 = ptls_buffer__do_pushv(emitter->buf,ch.cookie.all.base,ch.cookie.all.len);
      if (iVar28 != 0) goto LAB_0011260a;
      uVar42 = emitter->buf->off - (long)local_7e8;
      for (lVar46 = 8; lVar46 != -8; lVar46 = lVar46 + -8) {
        emitter->buf->base[(long)local_7e8 - 2] = (uint8_t)(uVar42 >> ((byte)lVar46 & 0x3f));
        local_7e8 = (ptls_cipher_suite_t *)((long)local_7e8 + 1);
      }
      uVar42 = emitter->buf->off - (long)local_7c0;
      for (lVar46 = 8; lVar46 != -8; lVar46 = lVar46 + -8) {
        emitter->buf->base[(long)local_7c0 - 2] = (uint8_t)(uVar42 >> ((byte)lVar46 & 0x3f));
        local_7c0 = (ptls_cipher_suite_t *)((long)local_7c0 + 1);
      }
      uVar42 = ppVar63->off - (long)local_7d0;
      for (lVar46 = 0x10; lVar46 != -8; lVar46 = lVar46 + -8) {
        ppVar63->base[(long)local_7d0 - 3] = (uint8_t)(uVar42 >> ((byte)lVar46 & 0x3f));
        local_7d0 = (ptls_aead_context_t *)((long)local_7d0 + 1);
      }
      if (ppVar34 != (ptls_key_schedule_t *)0x0) {
        ptls__key_schedule_update_hash(ppVar34,ppVar63->base + sVar59,ppVar63->off - sVar59);
      }
      iVar28 = (*emitter->commit_message)(emitter);
      if (iVar28 != 0) goto LAB_0011260a;
      emitter->buf->off = sVar51;
      goto LAB_0011274e;
    }
    if (key_share.algorithm != (ptls_key_exchange_algorithm_t *)0x0) {
      bVar67 = true;
      if ((properties != (ptls_handshake_properties_t *)0x0) &&
         (bVar67 = true, (*(byte *)((long)&properties->field_0 + 0x60) & 1) != 0))
      goto LAB_00112dcb;
      goto LAB_00112756;
    }
LAB_00112dcb:
    if (ch.negotiated_groups.base == (uint8_t *)0x0) {
      iVar28 = 0x6d;
      goto LAB_0011260a;
    }
    iVar28 = 0x32;
    if ((ch.negotiated_groups.len < 2) ||
       (uVar42 = (ulong)(ushort)(*(ushort *)ch.negotiated_groups.base << 8 |
                                *(ushort *)ch.negotiated_groups.base >> 8),
       ch.negotiated_groups.len - 2 < uVar42)) goto LAB_0011260a;
    local_7f0 = (ptls_buffer_t *)0x8;
    local_7e0 = 0x10;
    puVar61 = (ushort *)(ch.negotiated_groups.base + uVar42 + 2);
    puVar37 = (ushort *)ch.negotiated_groups.base;
    while (puVar37 = puVar37 + 1, puVar37 != puVar61) {
      if ((long)puVar61 - (long)puVar37 < 2) goto LAB_0011260a;
      pppVar36 = tls->ctx->key_exchanges;
      while (negotiated_group = *pppVar36, negotiated_group != (ptls_key_exchange_algorithm_t *)0x0)
      {
        pppVar36 = pppVar36 + 1;
        if (negotiated_group->id == (uint16_t)(*puVar37 << 8 | *puVar37 >> 8)) {
          ptls__key_schedule_update_hash(tls->key_schedule,puVar48,(size_t)puVar38);
          if (tls->key_schedule->generation != 0) {
            __assert_fail("tls->key_schedule->generation == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/lib/picotls.c"
                          ,0xebe,
                          "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                         );
          }
          if ((properties == (ptls_handshake_properties_t *)0x0) ||
             ((*(byte *)((long)&properties->field_0 + 0x60) & 2) == 0)) {
            key_schedule_transform_post_ch1hash(tls->key_schedule);
            key_schedule_extract(tls->key_schedule,(ptls_iovec_t)ZEXT816(0));
            iVar28 = (*emitter->begin_message)(emitter);
            if (iVar28 == 0) {
              ppVar63 = emitter->buf;
              ppVar34 = tls->key_schedule;
              sVar51 = ppVar63->off;
              local_7a6 = 2;
              iVar28 = ptls_buffer__do_pushv(ppVar63,&local_7a6,1);
              if ((iVar28 == 0) && (iVar28 = ptls_buffer__do_pushv(ppVar63,"",3), iVar28 == 0)) {
                local_7f0 = (ptls_buffer_t *)ppVar63->off;
                local_728[1] = 0x303;
                iVar28 = ptls_buffer__do_pushv(emitter->buf,local_728 + 1,2);
                if ((iVar28 == 0) && (iVar28 = ptls_buffer_reserve(emitter->buf,0x20), iVar28 == 0))
                {
                  puVar38 = emitter->buf->base;
                  sVar59 = emitter->buf->off;
                  puVar48 = puVar38 + sVar59 + 0x10;
                  puVar48[0] = 0xc2;
                  puVar48[1] = 0xa2;
                  puVar48[2] = '\x11';
                  puVar48[3] = '\x16';
                  puVar48[4] = 'z';
                  puVar48[5] = 0xbb;
                  puVar48[6] = 0x8c;
                  puVar48[7] = '^';
                  puVar48[8] = '\a';
                  puVar48[9] = 0x9e;
                  puVar48[10] = '\t';
                  puVar48[0xb] = 0xe2;
                  puVar48[0xc] = 200;
                  puVar48[0xd] = 0xa8;
                  puVar48[0xe] = '3';
                  puVar48[0xf] = 0x9c;
                  puVar38 = puVar38 + sVar59;
                  puVar38[0] = 0xcf;
                  puVar38[1] = '!';
                  puVar38[2] = 0xad;
                  puVar38[3] = 't';
                  puVar38[4] = 0xe5;
                  puVar38[5] = 0x9a;
                  puVar38[6] = 'a';
                  puVar38[7] = '\x11';
                  puVar38[8] = 0xbe;
                  puVar38[9] = '\x1d';
                  puVar38[10] = 0x8c;
                  puVar38[0xb] = '\x02';
                  puVar38[0xc] = '\x1e';
                  puVar38[0xd] = 'e';
                  puVar38[0xe] = 0xb8;
                  puVar38[0xf] = 0x91;
                  ppVar56 = emitter->buf;
                  psVar49 = &ppVar56->off;
                  *psVar49 = *psVar49 + 0x20;
                  iVar28 = ptls_buffer__do_pushv(ppVar56,"",1);
                  if (iVar28 == 0) {
                    sVar59 = emitter->buf->off;
                    iVar28 = ptls_buffer__do_pushv
                                       (emitter->buf,ch.legacy_session_id.base,
                                        ch.legacy_session_id.len);
                    if (iVar28 == 0) {
                      emitter->buf->base[sVar59 - 1] = (char)(int)emitter->buf->off - (char)sVar59;
                      uVar23 = tls->cipher_suite->id;
                      local_728[0] = uVar23 << 8 | uVar23 >> 8;
                      iVar28 = ptls_buffer__do_pushv(emitter->buf,local_728,2);
                      if (iVar28 == 0) {
                        local_7a7 = 0;
                        iVar28 = ptls_buffer__do_pushv(emitter->buf,&local_7a7,1);
                        if ((iVar28 == 0) &&
                           (iVar28 = ptls_buffer__do_pushv(emitter->buf,"",2), iVar28 == 0)) {
                          local_7d8 = (ptls_esni_context_t **)emitter->buf->off;
                          local_72a = 0x2b00;
                          iVar28 = ptls_buffer__do_pushv(emitter->buf,&local_72a,2);
                          if ((iVar28 == 0) &&
                             (iVar28 = ptls_buffer__do_pushv(emitter->buf,"",2), iVar28 == 0)) {
                            local_7e0 = emitter->buf->off;
                            local_730[2] = ch.selected_version << 8 | ch.selected_version >> 8;
                            iVar28 = ptls_buffer__do_pushv(emitter->buf,local_730 + 2,2);
                            if (iVar28 == 0) {
                              uVar42 = emitter->buf->off - local_7e0;
                              for (lVar46 = 8; lVar46 != -8; lVar46 = lVar46 + -8) {
                                emitter->buf->base[local_7e0 - 2] =
                                     (uint8_t)(uVar42 >> ((byte)lVar46 & 0x3f));
                                local_7e0 = local_7e0 + 1;
                              }
                              ppVar56 = emitter->buf;
                              if (ppVar10 == (ptls_key_exchange_algorithm_t *)0x0) {
                                local_730[1] = 0x3300;
                                iVar28 = ptls_buffer__do_pushv(ppVar56,local_730 + 1,2);
                                if ((iVar28 != 0) ||
                                   (iVar28 = ptls_buffer__do_pushv(emitter->buf,"",2), iVar28 != 0))
                                goto LAB_0011260a;
                                local_7e8 = (ptls_cipher_suite_t *)emitter->buf->off;
                                local_730[0] = negotiated_group->id << 8 | negotiated_group->id >> 8
                                ;
                                iVar28 = ptls_buffer__do_pushv(emitter->buf,local_730,2);
                                if (iVar28 != 0) goto LAB_0011260a;
                                uVar42 = emitter->buf->off - (long)local_7e8;
                                for (lVar46 = 8; lVar46 != -8; lVar46 = lVar46 + -8) {
                                  emitter->buf->base[(long)local_7e8 - 2] =
                                       (uint8_t)(uVar42 >> ((byte)lVar46 & 0x3f));
                                  local_7e8 = (ptls_cipher_suite_t *)((long)local_7e8 + 1);
                                }
                                ppVar56 = emitter->buf;
                              }
                              uVar42 = ppVar56->off - (long)local_7d8;
                              for (lVar46 = 8; lVar46 != -8; lVar46 = lVar46 + -8) {
                                emitter->buf->base[(long)local_7d8 - 2] =
                                     (uint8_t)(uVar42 >> ((byte)lVar46 & 0x3f));
                                local_7d8 = (ptls_esni_context_t **)((long)local_7d8 + 1);
                              }
                              uVar42 = ppVar63->off - (long)local_7f0;
                              for (lVar46 = 0x10; lVar46 != -8; lVar46 = lVar46 + -8) {
                                ppVar63->base[(long)local_7f0 - 3] =
                                     (uint8_t)(uVar42 >> ((byte)lVar46 & 0x3f));
                                local_7f0 = (ptls_buffer_t *)((long)local_7f0 + 1);
                              }
                              if (ppVar34 != (ptls_key_schedule_t *)0x0) {
                                ptls__key_schedule_update_hash
                                          (ppVar34,ppVar63->base + sVar51,ppVar63->off - sVar51);
                              }
                              iVar28 = (*emitter->commit_message)(emitter);
                              if ((iVar28 == 0) &&
                                 (iVar28 = push_change_cipher_spec(tls,emitter), iVar28 == 0)) {
                                tls->state = PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO;
                                iVar28 = 0x202;
                                if (ch.psk.early_data_indication != 0) {
                                  (tls->field_18).server.early_data_skipped_bytes = 0;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            goto LAB_0011260a;
          }
          iVar28 = (*emitter->begin_message)(emitter);
          if (iVar28 == 0) {
            ppVar63 = emitter->buf;
            local_7a3 = 2;
            iVar28 = ptls_buffer__do_pushv(ppVar63,&local_7a3,1);
            if ((iVar28 == 0) && (iVar28 = ptls_buffer__do_pushv(ppVar63,"",3), iVar28 == 0)) {
              local_7d8 = (ptls_esni_context_t **)ppVar63->off;
              local_718[0] = 0x303;
              iVar28 = ptls_buffer__do_pushv(emitter->buf,local_718,2);
              if ((iVar28 == 0) && (iVar28 = ptls_buffer_reserve(emitter->buf,0x20), iVar28 == 0)) {
                puVar38 = emitter->buf->base;
                sVar51 = emitter->buf->off;
                puVar48 = puVar38 + sVar51 + 0x10;
                puVar48[0] = 0xc2;
                puVar48[1] = 0xa2;
                puVar48[2] = '\x11';
                puVar48[3] = '\x16';
                puVar48[4] = 'z';
                puVar48[5] = 0xbb;
                puVar48[6] = 0x8c;
                puVar48[7] = '^';
                puVar48[8] = '\a';
                puVar48[9] = 0x9e;
                puVar48[10] = '\t';
                puVar48[0xb] = 0xe2;
                puVar48[0xc] = 200;
                puVar48[0xd] = 0xa8;
                puVar48[0xe] = '3';
                puVar48[0xf] = 0x9c;
                puVar38 = puVar38 + sVar51;
                puVar38[0] = 0xcf;
                puVar38[1] = '!';
                puVar38[2] = 0xad;
                puVar38[3] = 't';
                puVar38[4] = 0xe5;
                puVar38[5] = 0x9a;
                puVar38[6] = 'a';
                puVar38[7] = '\x11';
                puVar38[8] = 0xbe;
                puVar38[9] = '\x1d';
                puVar38[10] = 0x8c;
                puVar38[0xb] = '\x02';
                puVar38[0xc] = '\x1e';
                puVar38[0xd] = 'e';
                puVar38[0xe] = 0xb8;
                puVar38[0xf] = 0x91;
                ppVar56 = emitter->buf;
                psVar49 = &ppVar56->off;
                *psVar49 = *psVar49 + 0x20;
                iVar28 = ptls_buffer__do_pushv(ppVar56,"",1);
                if (iVar28 == 0) {
                  sVar51 = emitter->buf->off;
                  iVar28 = ptls_buffer__do_pushv
                                     (emitter->buf,ch.legacy_session_id.base,
                                      ch.legacy_session_id.len);
                  if (iVar28 == 0) {
                    emitter->buf->base[sVar51 - 1] = (char)(int)emitter->buf->off - (char)sVar51;
                    uVar23 = tls->cipher_suite->id;
                    local_71e[2] = uVar23 << 8 | uVar23 >> 8;
                    iVar28 = ptls_buffer__do_pushv(emitter->buf,local_71e + 2,2);
                    if (iVar28 == 0) {
                      local_7a4 = 0;
                      iVar28 = ptls_buffer__do_pushv(emitter->buf,&local_7a4,1);
                      if ((iVar28 == 0) &&
                         (iVar28 = ptls_buffer__do_pushv(emitter->buf,"",2), iVar28 == 0)) {
                        local_7d0 = (ptls_aead_context_t *)emitter->buf->off;
                        local_71e[1] = 0x2b00;
                        iVar28 = ptls_buffer__do_pushv(emitter->buf,local_71e + 1,2);
                        if ((iVar28 == 0) &&
                           (iVar28 = ptls_buffer__do_pushv(emitter->buf,"",2), iVar28 == 0)) {
                          sVar51 = emitter->buf->off;
                          local_71e[0] = ch.selected_version << 8 | ch.selected_version >> 8;
                          iVar28 = ptls_buffer__do_pushv(emitter->buf,local_71e,2);
                          if (iVar28 == 0) {
                            uVar42 = emitter->buf->off - sVar51;
                            for (; local_7f0 != (ptls_buffer_t *)0xfffffffffffffff8;
                                local_7f0 = (ptls_buffer_t *)((long)local_7f0 + -8)) {
                              emitter->buf->base[sVar51 - 2] =
                                   (uint8_t)(uVar42 >> ((byte)local_7f0 & 0x3f));
                              sVar51 = sVar51 + 1;
                            }
                            local_7f0 = emitter->buf;
                            if (ppVar10 == (ptls_key_exchange_algorithm_t *)0x0) {
                              local_720 = 0x3300;
                              iVar28 = ptls_buffer__do_pushv(local_7f0,&local_720,2);
                              if ((iVar28 != 0) ||
                                 (iVar28 = ptls_buffer__do_pushv(emitter->buf,"",2), iVar28 != 0))
                              goto LAB_0011260a;
                              local_7f0 = (ptls_buffer_t *)emitter->buf->off;
                              local_728[3] = negotiated_group->id << 8 | negotiated_group->id >> 8;
                              iVar28 = ptls_buffer__do_pushv(emitter->buf,local_728 + 3,2);
                              if (iVar28 != 0) goto LAB_0011260a;
                              uVar42 = emitter->buf->off - (long)local_7f0;
                              for (lVar46 = 8; lVar46 != -8; lVar46 = lVar46 + -8) {
                                emitter->buf->base[(long)local_7f0 - 2] =
                                     (uint8_t)(uVar42 >> ((byte)lVar46 & 0x3f));
                                local_7f0 = (ptls_buffer_t *)((long)local_7f0 + 1);
                              }
                              local_7f0 = emitter->buf;
                            }
                            local_728[2] = 0x2c00;
                            iVar28 = ptls_buffer__do_pushv(local_7f0,local_728 + 2,2);
                            if ((iVar28 == 0) &&
                               (iVar28 = ptls_buffer__do_pushv(local_7f0,"",2), iVar28 == 0)) {
                              sVar51 = local_7f0->off;
                              iVar28 = ptls_buffer__do_pushv(local_7f0,"",2);
                              if (iVar28 == 0) {
                                sVar59 = local_7f0->off;
                                iVar28 = ptls_buffer__do_pushv(local_7f0,"",2);
                                if (iVar28 == 0) {
                                  sVar64 = local_7f0->off;
                                  iVar28 = ptls_buffer__do_pushv(local_7f0,"",1);
                                  if (iVar28 == 0) {
                                    sVar65 = local_7f0->off;
                                    local_7a0 = (ptls_esni_secret_t *)
                                                tls->cipher_suite->hash->digest_size;
                                    iVar28 = ptls_buffer_reserve(local_7f0,(size_t)local_7a0);
                                    if (iVar28 == 0) {
                                      psVar40 = tls->key_schedule->hashes[0].ctx;
                                      (*psVar40->final)(psVar40,local_7f0->base + local_7f0->off,
                                                        PTLS_HASH_FINAL_MODE_RESET);
                                      sVar47 = local_7f0->off;
                                      local_7a5 = ppVar10 == (ptls_key_exchange_algorithm_t *)0x0;
                                      local_7f0->off = (size_t)(local_7a0->nonce + (sVar47 - 0x10));
                                      local_7f0->base[sVar65 - 1] =
                                           (char)(local_7a0->nonce + (sVar47 - 0x10)) - (char)sVar65
                                      ;
                                      iVar28 = ptls_buffer__do_pushv(local_7f0,&local_7a5,1);
                                      if (iVar28 == 0) {
                                        lVar46 = local_7f0->off - sVar64;
                                        local_7f0->base[sVar64 - 2] = (uint8_t)((ulong)lVar46 >> 8);
                                        local_7f0->base[sVar64 - 1] = (uint8_t)lVar46;
                                        sVar64 = local_7f0->off;
                                        iVar28 = ptls_buffer__do_pushv(local_7f0,"",1);
                                        if (iVar28 == 0) {
                                          sVar65 = local_7f0->off;
                                          sVar47 = (*tls->ctx->cipher_suites)->hash->digest_size;
                                          iVar28 = ptls_buffer_reserve(local_7f0,sVar47);
                                          if ((iVar28 == 0) &&
                                             (tbs_00.len = sVar64 - sVar59,
                                             tbs_00.base = local_7f0->base + sVar59,
                                             iVar28 = calc_cookie_signature
                                                                (tls,properties,negotiated_group,
                                                                 tbs_00,local_7f0->base +
                                                                        local_7f0->off), iVar28 == 0
                                             )) {
                                            sVar47 = sVar47 + local_7f0->off;
                                            local_7f0->off = sVar47;
                                            local_7f0->base[sVar65 - 1] =
                                                 (char)sVar47 - (char)sVar65;
                                            lVar46 = local_7f0->off - sVar59;
                                            local_7f0->base[sVar59 - 2] =
                                                 (uint8_t)((ulong)lVar46 >> 8);
                                            local_7f0->base[sVar59 - 1] = (uint8_t)lVar46;
                                            lVar46 = local_7f0->off - sVar51;
                                            local_7f0->base[sVar51 - 2] =
                                                 (uint8_t)((ulong)lVar46 >> 8);
                                            local_7f0->base[sVar51 - 1] = (uint8_t)lVar46;
                                            uVar42 = emitter->buf->off - (long)local_7d0;
                                            for (lVar46 = 8; lVar46 != -8; lVar46 = lVar46 + -8) {
                                              emitter->buf->base[(long)local_7d0 - 2] =
                                                   (uint8_t)(uVar42 >> ((byte)lVar46 & 0x3f));
                                              local_7d0 = (ptls_aead_context_t *)
                                                          ((long)local_7d0 + 1);
                                            }
                                            uVar42 = ppVar63->off - (long)local_7d8;
                                            for (; local_7e0 != -8; local_7e0 = local_7e0 + -8) {
                                              ppVar63->base[(long)local_7d8 - 3] =
                                                   (uint8_t)(uVar42 >> ((byte)local_7e0 & 0x3f));
                                              local_7d8 = (ptls_esni_context_t **)
                                                          ((long)local_7d8 + 1);
                                            }
                                            iVar28 = (*emitter->commit_message)(emitter);
                                            if (iVar28 == 0) {
                                              iVar29 = push_change_cipher_spec(tls,emitter);
                                              iVar28 = 0x206;
                                              if (iVar29 != 0) {
                                                iVar28 = iVar29;
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          goto LAB_0011260a;
        }
      }
    }
    puVar38 = (uint8_t *)
              ((long)puVar61 - (long)(ch.negotiated_groups.base + ch.negotiated_groups.len));
    iVar29 = 0x28;
    iVar28 = 0x32;
LAB_001135eb:
    if (puVar38 == (uint8_t *)0x0) {
      iVar28 = iVar29;
    }
    goto LAB_0011260a;
  }
LAB_0011274e:
  bVar67 = false;
LAB_00112756:
  iVar28 = report_unknown_extensions(tls,properties,ch.unknown_extensions);
  if (iVar28 != 0) goto LAB_0011260a;
  bVar66 = false;
  if (((((bool)(ch.psk.hash_end != (uint8_t *)0x0 & bVar67)) && ((ch.psk.ke_modes & 3) != 0)) &&
      (ppVar41 = tls->ctx, ppVar41->encrypt_ticket != (ptls_encrypt_ticket_t *)0x0)) &&
     ((ppVar41->field_0x70 & 8) == 0)) {
    sVar51 = (long)ch.psk.hash_end - (long)puVar48;
    uVar35 = (*ppVar41->get_time->cb)(ppVar41->get_time);
    decbuf.base = (uint8_t *)&cs;
    decbuf.off = 0;
    decbuf.capacity = 0x100;
    decbuf.is_allocated = 0;
    for (local_7e8 = (ptls_cipher_suite_t *)0x0; local_7e8 < ch.psk.identities.count;
        local_7e8 = (ptls_cipher_suite_t *)((long)local_7e8 + 1)) {
      decbuf.off = 0;
      psVar9 = tls->ctx->encrypt_ticket;
      pVar70.len = ch.psk.identities.list[(long)local_7e8].identity.len;
      pVar70.base = ch.psk.identities.list[(long)local_7e8].identity.base;
      iVar28 = (*psVar9->cb)(psVar9,tls,0,&decbuf,pVar70);
      if (iVar28 == 0) {
        bVar21 = 1;
LAB_0011285a:
        iVar28 = decode_session_identifier
                           (&issue_at,&ticket_psk,&age_add,&ticket_server_name,
                            &ticket_key_exchange_id,&ticket_csid,&ticket_negotiated_protocol,
                            decbuf.base,decbuf.base + decbuf.off);
        if (iVar28 == 0) {
          uVar42 = CONCAT71(issue_at._1_7_,(undefined1)issue_at);
          if ((uVar42 <= uVar35) &&
             (ppVar41 = tls->ctx, uVar35 - uVar42 <= (ulong)ppVar41->ticket_lifetime * 1000)) {
            bVar66 = false;
            if (!(bool)(bVar21 ^ 1) && ch.psk.early_data_indication != 0) {
              uVar45 = uVar35 - (uVar42 + (ch.psk.identities.list[(long)local_7e8].
                                           obfuscated_ticket_age - age_add));
              uVar42 = -uVar45;
              if (0 < (long)uVar45) {
                uVar42 = uVar45;
              }
              bVar66 = uVar42 < 0x2711;
            }
            pcVar7 = tls->server_name;
            if (ticket_server_name.len == 0) {
              if (pcVar7 == (char *)0x0) goto LAB_00112974;
            }
            else if ((pcVar7 != (char *)0x0) &&
                    (x.base._1_1_ = ticket_server_name.base._1_1_,
                    x.base._0_1_ = ticket_server_name.base._0_1_,
                    x.base._2_2_ = ticket_server_name.base._2_2_,
                    x.base._4_4_ = ticket_server_name.base._4_4_, x.len = ticket_server_name.len,
                    iVar28 = vec_is_string(x,pcVar7), iVar28 != 0)) {
LAB_00112974:
              pppVar36 = ppVar41->key_exchanges;
              do {
                ppVar10 = *pppVar36;
                if (ppVar10 == (ptls_key_exchange_algorithm_t *)0x0) goto LAB_001128dd;
                pppVar36 = pppVar36 + 1;
              } while (ppVar10->id != ticket_key_exchange_id);
              tls->key_share = ppVar10;
              if ((ticket_csid == tls->cipher_suite->id) &&
                 ((((ticket_negotiated_protocol.len == 0 ||
                    ((tls->negotiated_protocol != (char *)0x0 &&
                     (x_00.base._2_6_ = ticket_negotiated_protocol.base._2_6_,
                     x_00.base._0_2_ = (ushort)ticket_negotiated_protocol.base,
                     x_00.len = ticket_negotiated_protocol.len,
                     iVar28 = vec_is_string(x_00,tls->negotiated_protocol), iVar28 != 0)))) &&
                   (ticket_psk.len == (tls->key_schedule->hashes[0].algo)->digest_size)) &&
                  (ch.psk.identities.list[(long)local_7e8].binder.len == ticket_psk.len)))) {
                ikm_00.base._4_4_ = ticket_psk.base._4_4_;
                ikm_00.base._0_4_ = (uint)ticket_psk.base;
                ikm_00.len = ticket_psk.len;
                iVar28 = key_schedule_extract(tls->key_schedule,ikm_00);
                if ((iVar28 == 0) &&
                   (iVar28 = derive_secret(tls->key_schedule,binder_key,"res binder"), iVar28 == 0))
                {
                  ptls__key_schedule_update_hash(tls->key_schedule,puVar48,sVar51);
                  iVar28 = calc_verify_data(&bitmap,tls->key_schedule,binder_key);
                  if (iVar28 == 0) {
                    iVar29 = (*ptls_mem_equal)(ch.psk.identities.list[(long)local_7e8].binder.base,
                                               &bitmap,(tls->key_schedule->hashes[0].algo)->
                                                       digest_size);
                    iVar28 = 0x33;
                    if (iVar29 != 0) {
                      iVar28 = 0;
                    }
                  }
                }
                goto LAB_0011320d;
              }
            }
          }
        }
      }
      else if (iVar28 == 0x209) {
        bVar21 = 0;
        goto LAB_0011285a;
      }
LAB_001128dd:
    }
    tls->key_share = (ptls_key_exchange_algorithm_t *)0x0;
    bVar66 = false;
    local_7e8 = (ptls_cipher_suite_t *)0xffffffffffffffff;
    iVar28 = 0;
LAB_0011320d:
    ptls_buffer_dispose(&decbuf);
    (*ptls_clear_memory)(binder_key,0x40);
    (*ptls_clear_memory)(&bitmap,0x40);
    if (iVar28 != 0) goto LAB_0011260a;
    if (local_7e8 == (ptls_cipher_suite_t *)0xffffffffffffffff) goto LAB_00113293;
    if ((tls->ctx->field_0x70 & 8) != 0) goto LAB_0011329b;
    ptls__key_schedule_update_hash
              (tls->key_schedule,ch.psk.hash_end,(long)puVar37 - (long)ch.psk.hash_end);
    if ((ch.psk.ke_modes & 1) == 0) {
      if ((ch.psk.ke_modes & 2) == 0) {
        __assert_fail("(ch.psk.ke_modes & (1u << PTLS_PSK_KE_MODE_PSK_DHE)) != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/lib/picotls.c"
                      ,0xf19,
                      "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                     );
      }
      iVar29 = 2;
    }
    else {
      iVar29 = 1;
    }
    tls->field_0x160 = tls->field_0x160 | 2;
    if (properties != (ptls_handshake_properties_t *)0x0) {
      sVar33 = ch.psk.identities.list[(long)local_7e8].binder.len;
      memcpy(properties,ch.psk.identities.list[(long)local_7e8].binder.base,sVar33);
      goto LAB_001132d2;
    }
  }
  else {
LAB_00113293:
    local_7e8 = (ptls_cipher_suite_t *)0xffffffffffffffff;
LAB_0011329b:
    ptls__key_schedule_update_hash(tls->key_schedule,puVar48,(size_t)puVar38);
    if (bVar67) {
      if (tls->key_schedule->generation != 0) {
        __assert_fail("tls->key_schedule->generation == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/lib/picotls.c"
                      ,0xf0e,
                      "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                     );
      }
      key_schedule_extract(tls->key_schedule,(ptls_iovec_t)ZEXT816(0));
    }
    iVar29 = 0;
    if (properties != (ptls_handshake_properties_t *)0x0) {
      sVar33 = 0;
      iVar29 = 0;
LAB_001132d2:
      *(size_t *)((long)&properties->field_0 + 0x40) = sVar33;
    }
  }
  if (((bVar66) && (local_7e8 == (ptls_cipher_suite_t *)0x0)) &&
     (tls->ctx->max_early_data_size != 0)) {
    puVar38 = (uint8_t *)malloc(0x40);
    tls->pending_handshake_secret = puVar38;
    if (puVar38 == (uint8_t *)0x0) {
LAB_0011358b:
      iVar28 = 0x201;
      goto LAB_0011260a;
    }
    iVar28 = derive_exporter_secret(tls,1);
    if ((iVar28 != 0) || (iVar28 = setup_traffic_protection(tls,0,"c e traffic",1,0), iVar28 != 0))
    goto LAB_0011260a;
  }
  ppVar10 = key_share.algorithm;
  if (iVar29 != 1) {
    if (key_share.algorithm == (ptls_key_exchange_algorithm_t *)0x0) {
      iVar29 = 0x6d;
      iVar28 = 0x28;
      puVar38 = ch.key_shares.base;
      goto LAB_001135eb;
    }
    pVar20.len = key_share.peer_key.len;
    pVar20.base = key_share.peer_key.base;
    iVar28 = (*(key_share.algorithm)->exchange)(key_share.algorithm,&pubkey,&ecdh_secret,pVar20);
    if (iVar28 != 0) goto LAB_0011260a;
    tls->key_share = ppVar10;
  }
  iVar28 = (*emitter->begin_message)(emitter);
  if (iVar28 != 0) goto LAB_0011260a;
  ppVar63 = emitter->buf;
  ppVar34 = tls->key_schedule;
  sVar51 = ppVar63->off;
  local_7a8 = 2;
  iVar28 = ptls_buffer__do_pushv(ppVar63,&local_7a8,1);
  if ((iVar28 != 0) || (iVar28 = ptls_buffer__do_pushv(ppVar63,"",3), iVar28 != 0))
  goto LAB_0011260a;
  local_7e0 = ppVar63->off;
  local_732 = 0x303;
  iVar28 = ptls_buffer__do_pushv(emitter->buf,&local_732,2);
  if ((iVar28 != 0) || (iVar28 = ptls_buffer_reserve(emitter->buf,0x20), iVar28 != 0))
  goto LAB_0011260a;
  (*tls->ctx->random_bytes)(emitter->buf->base + emitter->buf->off,0x20);
  ppVar56 = emitter->buf;
  psVar49 = &ppVar56->off;
  *psVar49 = *psVar49 + 0x20;
  iVar28 = ptls_buffer__do_pushv(ppVar56,"",1);
  if (iVar28 != 0) goto LAB_0011260a;
  sVar59 = emitter->buf->off;
  iVar28 = ptls_buffer__do_pushv(emitter->buf,ch.legacy_session_id.base,ch.legacy_session_id.len);
  if (iVar28 != 0) goto LAB_0011260a;
  emitter->buf->base[sVar59 - 1] = (char)(int)emitter->buf->off - (char)sVar59;
  uVar23 = tls->cipher_suite->id;
  local_738[2] = uVar23 << 8 | uVar23 >> 8;
  iVar28 = ptls_buffer__do_pushv(emitter->buf,local_738 + 2,2);
  if (iVar28 != 0) goto LAB_0011260a;
  local_7a9 = 0;
  iVar28 = ptls_buffer__do_pushv(emitter->buf,&local_7a9,1);
  if ((iVar28 != 0) || (iVar28 = ptls_buffer__do_pushv(emitter->buf,"",2), iVar28 != 0))
  goto LAB_0011260a;
  local_7d0 = (ptls_aead_context_t *)emitter->buf->off;
  local_738[1] = 0x2b00;
  iVar28 = ptls_buffer__do_pushv(emitter->buf,local_738 + 1,2);
  if ((iVar28 != 0) || (iVar28 = ptls_buffer__do_pushv(emitter->buf,"",2), iVar28 != 0))
  goto LAB_0011260a;
  local_7d8 = (ptls_esni_context_t **)emitter->buf->off;
  local_738[0] = ch.selected_version << 8 | ch.selected_version >> 8;
  iVar28 = ptls_buffer__do_pushv(emitter->buf,local_738,2);
  if (iVar28 != 0) goto LAB_0011260a;
  uVar42 = emitter->buf->off - (long)local_7d8;
  for (lVar46 = 8; lVar46 != -8; lVar46 = lVar46 + -8) {
    emitter->buf->base[(long)local_7d8 - 2] = (uint8_t)(uVar42 >> ((byte)lVar46 & 0x3f));
    local_7d8 = (ptls_esni_context_t **)((long)local_7d8 + 1);
  }
  ppVar56 = emitter->buf;
  if (iVar29 == 1) {
LAB_00113bb3:
    local_740[1] = 0x2900;
    iVar28 = ptls_buffer__do_pushv(ppVar56,local_740 + 1,2);
    if ((iVar28 != 0) || (iVar28 = ptls_buffer__do_pushv(ppVar56,"",2), iVar28 != 0))
    goto LAB_0011260a;
    sVar59 = ppVar56->off;
    local_740[0] = (ushort)local_7e8 << 8 | (ushort)local_7e8 >> 8;
    iVar28 = ptls_buffer__do_pushv(ppVar56,local_740,2);
    if (iVar28 != 0) goto LAB_0011260a;
    lVar46 = ppVar56->off - sVar59;
    ppVar56->base[sVar59 - 2] = (uint8_t)((ulong)lVar46 >> 8);
    ppVar56->base[sVar59 - 1] = (uint8_t)lVar46;
  }
  else {
    local_73a = 0x3300;
    iVar28 = ptls_buffer__do_pushv(ppVar56,&local_73a,2);
    if ((iVar28 != 0) || (iVar28 = ptls_buffer__do_pushv(ppVar56,"",2), iVar28 != 0))
    goto LAB_0011260a;
    sVar59 = ppVar56->off;
    local_740[2] = (key_share.algorithm)->id << 8 | (key_share.algorithm)->id >> 8;
    iVar28 = ptls_buffer__do_pushv(ppVar56,local_740 + 2,2);
    if ((iVar28 != 0) || (iVar28 = ptls_buffer__do_pushv(ppVar56,"",2), iVar28 != 0))
    goto LAB_0011260a;
    sVar64 = ppVar56->off;
    iVar28 = ptls_buffer__do_pushv(ppVar56,pubkey.base,pubkey.len);
    if (iVar28 != 0) goto LAB_0011260a;
    lVar46 = ppVar56->off - sVar64;
    ppVar56->base[sVar64 - 2] = (uint8_t)((ulong)lVar46 >> 8);
    ppVar56->base[sVar64 - 1] = (uint8_t)lVar46;
    lVar46 = ppVar56->off - sVar59;
    ppVar56->base[sVar59 - 2] = (uint8_t)((ulong)lVar46 >> 8);
    ppVar56->base[sVar59 - 1] = (uint8_t)lVar46;
    if (iVar29 != 0) goto LAB_00113bb3;
  }
  uVar42 = emitter->buf->off - (long)local_7d0;
  for (lVar46 = 8; lVar46 != -8; lVar46 = lVar46 + -8) {
    emitter->buf->base[(long)local_7d0 - 2] = (uint8_t)(uVar42 >> ((byte)lVar46 & 0x3f));
    local_7d0 = (ptls_aead_context_t *)((long)local_7d0 + 1);
  }
  uVar42 = ppVar63->off - local_7e0;
  for (lVar46 = 0x10; lVar46 != -8; lVar46 = lVar46 + -8) {
    ppVar63->base[local_7e0 - 3] = (uint8_t)(uVar42 >> ((byte)lVar46 & 0x3f));
    local_7e0 = local_7e0 + 1;
  }
  if (ppVar34 != (ptls_key_schedule_t *)0x0) {
    ptls__key_schedule_update_hash(ppVar34,ppVar63->base + sVar51,ppVar63->off - sVar51);
  }
  iVar28 = (*emitter->commit_message)(emitter);
  if ((iVar28 != 0) || (iVar28 = push_change_cipher_spec(tls,emitter), iVar28 != 0))
  goto LAB_0011260a;
  if (tls->key_schedule->generation != 1) {
    __assert_fail("tls->key_schedule->generation == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/lib/picotls.c"
                  ,0xf4e,
                  "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                 );
  }
  ikm.len = ecdh_secret.len;
  ikm.base = ecdh_secret.base;
  key_schedule_extract(tls->key_schedule,ikm);
  iVar28 = setup_traffic_protection(tls,1,"s hs traffic",2,0);
  if (iVar28 != 0) goto LAB_0011260a;
  if (tls->pending_handshake_secret == (uint8_t *)0x0) {
    iVar28 = setup_traffic_protection(tls,0,"c hs traffic",2,0);
    if (iVar28 != 0) goto LAB_0011260a;
    if (ch.psk.early_data_indication != 0) {
      (tls->field_18).server.early_data_skipped_bytes = 0;
    }
  }
  else {
    iVar28 = derive_secret(tls->key_schedule,tls->pending_handshake_secret,"c hs traffic");
    if ((iVar28 != 0) ||
       ((psVar13 = tls->ctx->update_traffic_key, psVar13 != (st_ptls_update_traffic_key_t *)0x0 &&
        (iVar28 = (*psVar13->cb)(psVar13,tls,0,2,tls->pending_handshake_secret), iVar28 != 0))))
    goto LAB_0011260a;
  }
  iVar28 = (*emitter->begin_message)(emitter);
  if (iVar28 != 0) goto LAB_0011260a;
  ppVar63 = emitter->buf;
  ppVar34 = tls->key_schedule;
  sVar51 = ppVar63->off;
  local_7aa = 8;
  iVar28 = ptls_buffer__do_pushv(ppVar63,&local_7aa,1);
  if ((iVar28 != 0) || (iVar28 = ptls_buffer__do_pushv(ppVar63,"",3), iVar28 != 0))
  goto LAB_0011260a;
  local_7f0 = (ptls_buffer_t *)ppVar63->off;
  ppVar56 = emitter->buf;
  iVar28 = ptls_buffer__do_pushv(ppVar56,"",2);
  if (iVar28 != 0) goto LAB_0011260a;
  sVar59 = ppVar56->off;
  if (tls->esni == (ptls_esni_secret_t *)0x0) {
    if (tls->server_name != (char *)0x0) {
      local_744 = 0;
      iVar28 = ptls_buffer__do_pushv(ppVar56,&local_744,2);
      if ((iVar28 != 0) || (iVar28 = ptls_buffer__do_pushv(ppVar56,"",2), iVar28 != 0))
      goto LAB_0011260a;
      sVar64 = ppVar56->off;
      for (lVar46 = -2; lVar46 != 0; lVar46 = lVar46 + 1) {
        ppVar56->base[lVar46 + sVar64] = '\0';
      }
    }
  }
  else {
    local_742 = 0xceff;
    iVar28 = ptls_buffer__do_pushv(ppVar56,&local_742,2);
    if ((iVar28 != 0) || (iVar28 = ptls_buffer__do_pushv(ppVar56,"",2), iVar28 != 0))
    goto LAB_0011260a;
    sVar64 = ppVar56->off;
    cs = (ptls_cipher_suite_t *)((ulong)cs & 0xffffffffffffff00);
    iVar28 = ptls_buffer__do_pushv(ppVar56,&cs,1);
    if (iVar28 != 0) goto LAB_0011260a;
    iVar28 = ptls_buffer__do_pushv(ppVar56,tls->esni->nonce,0x10);
    if (iVar28 != 0) goto LAB_0011260a;
    lVar46 = ppVar56->off - sVar64;
    ppVar56->base[sVar64 - 2] = (uint8_t)((ulong)lVar46 >> 8);
    ppVar56->base[sVar64 - 1] = (uint8_t)lVar46;
    free_esni_secret(&tls->esni,1);
  }
  if (tls->negotiated_protocol != (char *)0x0) {
    local_746 = 0x1000;
    iVar28 = ptls_buffer__do_pushv(ppVar56,&local_746,2);
    if ((iVar28 != 0) || (iVar28 = ptls_buffer__do_pushv(ppVar56,"",2), iVar28 != 0))
    goto LAB_0011260a;
    sVar64 = ppVar56->off;
    iVar28 = ptls_buffer__do_pushv(ppVar56,"",2);
    if (iVar28 != 0) goto LAB_0011260a;
    sVar65 = ppVar56->off;
    iVar28 = ptls_buffer__do_pushv(ppVar56,"",1);
    if (iVar28 != 0) goto LAB_0011260a;
    sVar47 = ppVar56->off;
    pcVar7 = tls->negotiated_protocol;
    sVar33 = strlen(pcVar7);
    iVar28 = ptls_buffer__do_pushv(ppVar56,pcVar7,sVar33);
    if (iVar28 != 0) goto LAB_0011260a;
    ppVar56->base[sVar47 - 1] = (char)(int)ppVar56->off - (char)sVar47;
    lVar46 = ppVar56->off - sVar65;
    ppVar56->base[sVar65 - 2] = (uint8_t)((ulong)lVar46 >> 8);
    ppVar56->base[sVar65 - 1] = (uint8_t)lVar46;
    lVar46 = ppVar56->off - sVar64;
    ppVar56->base[sVar64 - 2] = (uint8_t)((ulong)lVar46 >> 8);
    ppVar56->base[sVar64 - 1] = (uint8_t)lVar46;
  }
  if (tls->pending_handshake_secret != (uint8_t *)0x0) {
    local_748 = 0x2a00;
    iVar28 = ptls_buffer__do_pushv(ppVar56,&local_748,2);
    if ((iVar28 != 0) || (iVar28 = ptls_buffer__do_pushv(ppVar56,"",2), iVar28 != 0))
    goto LAB_0011260a;
    sVar64 = ppVar56->off;
    for (lVar46 = -2; lVar46 != 0; lVar46 = lVar46 + 1) {
      ppVar56->base[lVar46 + sVar64] = '\0';
    }
  }
  iVar28 = push_additional_extensions(properties,ppVar56);
  if (iVar28 != 0) goto LAB_0011260a;
  lVar46 = ppVar56->off - sVar59;
  ppVar56->base[sVar59 - 2] = (uint8_t)((ulong)lVar46 >> 8);
  ppVar56->base[sVar59 - 1] = (uint8_t)lVar46;
  uVar42 = ppVar63->off - (long)local_7f0;
  for (lVar46 = 0x10; lVar46 != -8; lVar46 = lVar46 + -8) {
    ppVar63->base[(long)local_7f0 - 3] = (uint8_t)(uVar42 >> ((byte)lVar46 & 0x3f));
    local_7f0 = (ptls_buffer_t *)((long)local_7f0 + 1);
  }
  if (ppVar34 != (ptls_key_schedule_t *)0x0) {
    ptls__key_schedule_update_hash(ppVar34,ppVar63->base + sVar51,ppVar63->off - sVar51);
  }
  iVar28 = (*emitter->commit_message)(emitter);
  if (iVar28 != 0) goto LAB_0011260a;
  if (iVar29 == 0) {
    if ((tls->ctx->field_0x70 & 8) != 0) {
      iVar28 = (*emitter->begin_message)(emitter);
      if (iVar28 != 0) goto LAB_0011260a;
      ppVar63 = emitter->buf;
      ppVar34 = tls->key_schedule;
      sVar51 = ppVar63->off;
      local_7ab = 0xd;
      iVar28 = ptls_buffer__do_pushv(ppVar63,&local_7ab,1);
      if ((iVar28 != 0) || (iVar28 = ptls_buffer__do_pushv(ppVar63,"",3), iVar28 != 0))
      goto LAB_0011260a;
      local_7e8 = (ptls_cipher_suite_t *)ppVar63->off;
      ppVar56 = emitter->buf;
      local_7ac = 0;
      iVar28 = ptls_buffer__do_pushv(ppVar56,&local_7ac,1);
      if ((iVar28 != 0) || (iVar28 = ptls_buffer__do_pushv(ppVar56,"",2), iVar28 != 0))
      goto LAB_0011260a;
      sVar59 = ppVar56->off;
      local_74a = 0xd00;
      iVar28 = ptls_buffer__do_pushv(ppVar56,&local_74a,2);
      if ((iVar28 != 0) || (iVar28 = ptls_buffer__do_pushv(ppVar56,"",2), iVar28 != 0))
      goto LAB_0011260a;
      sVar64 = ppVar56->off;
      iVar28 = push_signature_algorithms(ppVar56);
      if (iVar28 != 0) goto LAB_0011260a;
      lVar46 = ppVar56->off - sVar64;
      ppVar56->base[sVar64 - 2] = (uint8_t)((ulong)lVar46 >> 8);
      ppVar56->base[sVar64 - 1] = (uint8_t)lVar46;
      lVar46 = ppVar56->off - sVar59;
      ppVar56->base[sVar59 - 2] = (uint8_t)((ulong)lVar46 >> 8);
      ppVar56->base[sVar59 - 1] = (uint8_t)lVar46;
      uVar42 = ppVar63->off - (long)local_7e8;
      for (lVar46 = 0x10; lVar46 != -8; lVar46 = lVar46 + -8) {
        ppVar63->base[(long)local_7e8 - 3] = (uint8_t)(uVar42 >> ((byte)lVar46 & 0x3f));
        local_7e8 = (ptls_cipher_suite_t *)((long)local_7e8 + 1);
      }
      if (ppVar34 != (ptls_key_schedule_t *)0x0) {
        ptls__key_schedule_update_hash(ppVar34,ppVar63->base + sVar51,ppVar63->off - sVar51);
      }
      iVar28 = (*emitter->commit_message)(emitter);
      if (iVar28 != 0) goto LAB_0011260a;
    }
    iVar28 = send_certificate_and_certificate_verify
                       (tls,emitter,&ch.signature_algorithms,(ptls_iovec_t)ZEXT816(0),
                        "TLS 1.3, server CertificateVerify",(byte)ch._1248_1_ & 1,
                        ch.cert_compression_algos.list,ch.cert_compression_algos.count);
    if (iVar28 != 0) goto LAB_0011260a;
  }
  iVar28 = send_finished(tls,emitter);
  if (iVar28 != 0) goto LAB_0011260a;
  if (tls->key_schedule->generation != 2) {
    __assert_fail("tls->key_schedule->generation == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/lib/picotls.c"
                  ,0xfa4,
                  "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                 );
  }
  iVar28 = key_schedule_extract(tls->key_schedule,(ptls_iovec_t)ZEXT816(0));
  if ((((iVar28 != 0) || (iVar28 = setup_traffic_protection(tls,1,"s ap traffic",3,0), iVar28 != 0))
      || (iVar28 = derive_secret(tls->key_schedule,&tls->field_18,"c ap traffic"), iVar28 != 0)) ||
     (iVar28 = derive_exporter_secret(tls,0), iVar28 != 0)) goto LAB_0011260a;
  ppVar41 = tls->ctx;
  if (tls->pending_handshake_secret == (uint8_t *)0x0) {
    if ((ppVar41->field_0x70 & 8) == 0) {
      tls->state = PTLS_STATE_SERVER_EXPECT_FINISHED;
    }
    else {
      tls->state = PTLS_STATE_SERVER_EXPECT_CERTIFICATE;
    }
  }
  else if ((ppVar41->field_0x70 & 0x10) == 0) {
    tls->state = PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA;
  }
  else {
    iVar28 = commission_handshake_secret(tls);
    if (iVar28 != 0) goto LAB_0011260a;
    tls->state = PTLS_STATE_SERVER_EXPECT_FINISHED;
    ppVar41 = tls->ctx;
  }
  if ((ch.psk.ke_modes != 0) && (ppVar41->ticket_lifetime != 0)) {
    psVar40 = tls->key_schedule->hashes[0].ctx;
    psVar40 = (*psVar40->clone_)(psVar40);
    ppVar41 = tls->ctx;
    if (ppVar41->ticket_lifetime == 0) {
      __assert_fail("tls->ctx->ticket_lifetime != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/lib/picotls.c"
                    ,0x584,"int send_session_ticket(ptls_t *, ptls_message_emitter_t *)");
    }
    if (ppVar41->encrypt_ticket == (ptls_encrypt_ticket_t *)0x0) {
      __assert_fail("tls->ctx->encrypt_ticket != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/lib/picotls.c"
                    ,0x585,"int send_session_ticket(ptls_t *, ptls_message_emitter_t *)");
    }
    ppVar63 = emitter->buf;
    sVar51 = ppVar63->off;
    if ((tls->pending_handshake_secret == (uint8_t *)0x0) || ((ppVar41->field_0x70 & 0x10) != 0)) {
LAB_00114ece:
      ppVar34 = tls->key_schedule;
      age_add = CONCAT31(age_add._1_3_,0x14);
      iVar28 = ptls_buffer__do_pushv(ppVar63,&age_add,1);
      if ((iVar28 == 0) && (iVar28 = ptls_buffer__do_pushv(ppVar63,"",3), iVar28 == 0)) {
        sVar59 = ppVar63->off;
        iVar28 = ptls_buffer_reserve(emitter->buf,(tls->key_schedule->hashes[0].algo)->digest_size);
        if (iVar28 == 0) {
          secret = &tls->traffic_protection;
          if ((anon_struct_176_2_4ca0e81c_for_traffic_protection *)tls->pending_handshake_secret !=
              (anon_struct_176_2_4ca0e81c_for_traffic_protection *)0x0) {
            secret = (anon_struct_176_2_4ca0e81c_for_traffic_protection *)
                     tls->pending_handshake_secret;
          }
          iVar28 = calc_verify_data(emitter->buf->base + emitter->buf->off,tls->key_schedule,secret)
          ;
          if (iVar28 == 0) {
            psVar49 = &emitter->buf->off;
            *psVar49 = *psVar49 + (tls->key_schedule->hashes[0].algo)->digest_size;
            uVar42 = ppVar63->off - sVar59;
            for (lVar46 = 0x10; lVar46 != -8; lVar46 = lVar46 + -8) {
              ppVar63->base[sVar59 - 3] = (uint8_t)(uVar42 >> ((byte)lVar46 & 0x3f));
              sVar59 = sVar59 + 1;
            }
            if (ppVar34 != (ptls_key_schedule_t *)0x0) {
              ptls__key_schedule_update_hash(ppVar34,ppVar63->base + sVar51,ppVar63->off - sVar51);
            }
            emitter->buf->off = sVar51;
            (*tls->ctx->random_bytes)(&ticket_psk,4);
            uVar30 = (uint)ticket_psk.base;
            binder_key._0_8_ = &cs;
            binder_key[0x10] = '\0';
            binder_key[0x11] = '\0';
            binder_key[0x12] = '\0';
            binder_key[0x13] = '\0';
            binder_key[0x14] = '\0';
            binder_key[0x15] = '\0';
            binder_key[0x16] = '\0';
            binder_key[0x17] = '\0';
            binder_key[8] = 0x80;
            binder_key[9] = '\0';
            binder_key[10] = '\0';
            binder_key[0xb] = '\0';
            binder_key[0xc] = '\0';
            binder_key[0xd] = '\0';
            binder_key[0xe] = '\0';
            binder_key[0xf] = '\0';
            binder_key[0x18] = '\0';
            binder_key[0x19] = '\0';
            binder_key[0x1a] = '\0';
            binder_key[0x1b] = '\0';
            ppVar41 = tls->ctx;
            ppVar34 = tls->key_schedule;
            pcVar7 = tls->server_name;
            uVar3 = tls->key_share->id;
            uVar23 = tls->cipher_suite->id;
            __s = tls->negotiated_protocol;
            iVar28 = ptls_buffer__do_pushv((ptls_buffer_t *)binder_key,"",2);
            uVar16 = binder_key._16_8_;
            if ((iVar28 == 0) &&
               (iVar28 = ptls_buffer__do_pushv((ptls_buffer_t *)binder_key,"ptls0001",8),
               iVar28 == 0)) {
              psVar14 = ppVar41->get_time;
              uVar35 = (*psVar14->cb)(psVar14);
              bitmap.bits = (uint8_t  [8])
                            (uVar35 >> 0x38 | (uVar35 & 0xff000000000000) >> 0x28 |
                             (uVar35 & 0xff0000000000) >> 0x18 | (uVar35 & 0xff00000000) >> 8 |
                             (uVar35 & 0xff000000) << 8 | (uVar35 & 0xff0000) << 0x18 |
                             (uVar35 & 0xff00) << 0x28 | uVar35 << 0x38);
              local_7e8 = (ptls_cipher_suite_t *)0x8;
              iVar28 = ptls_buffer__do_pushv((ptls_buffer_t *)binder_key,&bitmap,8);
              if ((iVar28 == 0) &&
                 (((iVar28 = ptls_buffer__do_pushv((ptls_buffer_t *)binder_key,"",2),
                   uVar17 = binder_key._16_8_, iVar28 == 0 &&
                   (iVar28 = ptls_buffer_reserve((ptls_buffer_t *)binder_key,
                                                 (ppVar34->hashes[0].algo)->digest_size),
                   uVar22 = binder_key._16_8_, uVar18 = binder_key._0_8_, iVar28 == 0)) &&
                  (iVar28 = derive_resumption_secret
                                      (ppVar34,(uint8_t *)(binder_key._0_8_ + binder_key._16_8_),
                                       (ptls_iovec_t)ZEXT816(0)), iVar28 == 0)))) {
                binder_key._16_8_ = uVar22 + (ppVar34->hashes[0].algo)->digest_size;
                *(char *)(uVar18 + -2 + uVar17) = (char)((ulong)(binder_key._16_8_ - uVar17) >> 8);
                *(char *)(uVar18 + -1 + uVar17) = (char)(binder_key._16_8_ - uVar17);
                ticket_server_name.base._0_1_ = (undefined1)(uVar3 >> 8);
                ticket_server_name.base._1_1_ = (undefined1)uVar3;
                iVar28 = ptls_buffer__do_pushv((ptls_buffer_t *)binder_key,&ticket_server_name,2);
                if (iVar28 == 0) {
                  ticket_negotiated_protocol.base._0_2_ = uVar23 << 8 | uVar23 >> 8;
                  iVar28 = ptls_buffer__do_pushv
                                     ((ptls_buffer_t *)binder_key,&ticket_negotiated_protocol,2);
                  if (iVar28 == 0) {
                    decbuf.base = (uint8_t *)
                                  CONCAT44(decbuf.base._4_4_,
                                           uVar30 >> 0x18 | (uVar30 & 0xff0000) >> 8 |
                                           (uVar30 & 0xff00) << 8 | uVar30 << 0x18);
                    iVar28 = ptls_buffer__do_pushv((ptls_buffer_t *)binder_key,&decbuf,4);
                    if ((iVar28 == 0) &&
                       (iVar28 = ptls_buffer__do_pushv((ptls_buffer_t *)binder_key,"",2),
                       uVar17 = binder_key._16_8_, iVar28 == 0)) {
                      sVar25 = (short)binder_key._16_8_;
                      sVar26 = sVar25;
                      if (pcVar7 != (char *)0x0) {
                        sVar33 = strlen(pcVar7);
                        iVar28 = ptls_buffer__do_pushv((ptls_buffer_t *)binder_key,pcVar7,sVar33);
                        if (iVar28 != 0) goto LAB_0011554b;
                        sVar26 = (short)binder_key._16_8_;
                      }
                      uVar23 = sVar26 - sVar25;
                      *(ushort *)(binder_key._0_8_ + -2 + uVar17) = uVar23 * 0x100 | uVar23 >> 8;
                      iVar28 = ptls_buffer__do_pushv((ptls_buffer_t *)binder_key,"",1);
                      uVar17 = binder_key._16_8_;
                      if (iVar28 == 0) {
                        if (__s != (char *)0x0) {
                          sVar33 = strlen(__s);
                          iVar28 = ptls_buffer__do_pushv((ptls_buffer_t *)binder_key,__s,sVar33);
                          if (iVar28 != 0) goto LAB_0011554b;
                        }
                        uVar22 = binder_key._16_8_;
                        uVar18 = binder_key._0_8_;
                        *(uint8_t *)(binder_key._0_8_ + -1 + uVar17) =
                             (uint8_t)binder_key._16_8_ - (uint8_t)uVar17;
                        *(char *)(binder_key._0_8_ + -2 + uVar16) =
                             (char)((ulong)(binder_key._16_8_ - uVar16) >> 8);
                        *(char *)(binder_key._0_8_ + -1 + uVar16) =
                             (char)(binder_key._16_8_ - uVar16);
                        iVar28 = (*emitter->begin_message)(emitter);
                        if (iVar28 == 0) {
                          ppVar63 = emitter->buf;
                          ppVar34 = tls->key_schedule;
                          sVar51 = ppVar63->off;
                          ticket_key_exchange_id = CONCAT11(ticket_key_exchange_id._1_1_,4);
                          iVar28 = ptls_buffer__do_pushv(ppVar63,&ticket_key_exchange_id,1);
                          if ((iVar28 == 0) &&
                             (iVar28 = ptls_buffer__do_pushv(ppVar63,"",3), iVar28 == 0)) {
                            sVar59 = ppVar63->off;
                            uVar30 = tls->ctx->ticket_lifetime;
                            uVar30 = uVar30 >> 0x18 | (uVar30 & 0xff0000) >> 8 |
                                     (uVar30 & 0xff00) << 8 | uVar30 << 0x18;
                            bitmap.bits[0] = (char)uVar30;
                            bitmap.bits[1] = (char)(uVar30 >> 8);
                            bitmap.bits[2] = (char)(uVar30 >> 0x10);
                            bitmap.bits[3] = (char)(uVar30 >> 0x18);
                            iVar28 = ptls_buffer__do_pushv(emitter->buf,&bitmap,4);
                            if (iVar28 == 0) {
                              decbuf.base = (uint8_t *)
                                            CONCAT44(decbuf.base._4_4_,
                                                     (uint)ticket_psk.base >> 0x18 |
                                                     ((uint)ticket_psk.base & 0xff0000) >> 8 |
                                                     ((uint)ticket_psk.base & 0xff00) << 8 |
                                                     (uint)ticket_psk.base << 0x18);
                              iVar28 = ptls_buffer__do_pushv(emitter->buf,&decbuf,4);
                              if ((iVar28 == 0) &&
                                 (iVar28 = ptls_buffer__do_pushv(emitter->buf,"",1), iVar28 == 0)) {
                                emitter->buf->base[emitter->buf->off - 1] = '\0';
                                iVar28 = ptls_buffer__do_pushv(emitter->buf,"",2);
                                uVar16 = binder_key._16_8_;
                                if (iVar28 == 0) {
                                  sVar64 = emitter->buf->off;
                                  psVar9 = tls->ctx->encrypt_ticket;
                                  binder_key[0x10] = (uint8_t)uVar22;
                                  binder_key[0x11] = SUB81(uVar22,1);
                                  binder_key[0x12] = SUB81(uVar22,2);
                                  binder_key[0x13] = SUB81(uVar22,3);
                                  binder_key[0x14] = SUB81(uVar22,4);
                                  binder_key[0x15] = SUB81(uVar22,5);
                                  binder_key[0x16] = SUB81(uVar22,6);
                                  binder_key[0x17] = SUB81(uVar22,7);
                                  pVar71.len._0_1_ = binder_key[0x10];
                                  pVar71.len._1_1_ = binder_key[0x11];
                                  pVar71.len._2_1_ = binder_key[0x12];
                                  pVar71.len._3_1_ = binder_key[0x13];
                                  pVar71.len._4_1_ = binder_key[0x14];
                                  pVar71.len._5_1_ = binder_key[0x15];
                                  pVar71.len._6_1_ = binder_key[0x16];
                                  pVar71.len._7_1_ = binder_key[0x17];
                                  pVar71.base = (uint8_t *)uVar18;
                                  binder_key._16_8_ = uVar16;
                                  iVar28 = (*psVar9->cb)(psVar9,tls,1,emitter->buf,pVar71);
                                  if (iVar28 == 0) {
                                    uVar42 = emitter->buf->off - sVar64;
                                    for (; local_7e8 != (ptls_cipher_suite_t *)0xfffffffffffffff8;
                                        local_7e8 = (ptls_cipher_suite_t *)((long)local_7e8 + -8)) {
                                      emitter->buf->base[sVar64 - 2] =
                                           (uint8_t)(uVar42 >> ((byte)local_7e8 & 0x3f));
                                      sVar64 = sVar64 + 1;
                                    }
                                    iVar28 = ptls_buffer__do_pushv(emitter->buf,"",2);
                                    if (iVar28 == 0) {
                                      sVar64 = emitter->buf->off;
                                      sVar65 = sVar64;
                                      if (tls->ctx->max_early_data_size == 0) {
LAB_001154cd:
                                        uVar42 = sVar65 - sVar64;
                                        for (lVar46 = 8; lVar46 != -8; lVar46 = lVar46 + -8) {
                                          emitter->buf->base[sVar64 - 2] =
                                               (uint8_t)(uVar42 >> ((byte)lVar46 & 0x3f));
                                          sVar64 = sVar64 + 1;
                                        }
                                        uVar42 = ppVar63->off - sVar59;
                                        for (lVar46 = 0x10; lVar46 != -8; lVar46 = lVar46 + -8) {
                                          ppVar63->base[sVar59 - 3] =
                                               (uint8_t)(uVar42 >> ((byte)lVar46 & 0x3f));
                                          sVar59 = sVar59 + 1;
                                        }
                                        if (ppVar34 != (ptls_key_schedule_t *)0x0) {
                                          ptls__key_schedule_update_hash
                                                    (ppVar34,ppVar63->base + sVar51,
                                                     ppVar63->off - sVar51);
                                        }
                                        iVar28 = (*emitter->commit_message)(emitter);
                                      }
                                      else {
                                        ticket_negotiated_protocol.base._0_2_ = 0x2a00;
                                        iVar28 = ptls_buffer__do_pushv
                                                           (emitter->buf,&ticket_negotiated_protocol
                                                            ,2);
                                        if ((iVar28 == 0) &&
                                           (iVar28 = ptls_buffer__do_pushv(emitter->buf,"",2),
                                           iVar28 == 0)) {
                                          sVar65 = emitter->buf->off;
                                          uVar5 = tls->ctx->max_early_data_size;
                                          ticket_server_name.base._1_1_ =
                                               (undefined1)(uVar5 >> 0x10);
                                          ticket_server_name.base._2_2_ =
                                               (ushort)(uVar5 >> 8) & 0xff |
                                               (ushort)((uVar5 << 0x18) >> 0x10);
                                          ticket_server_name.base._0_1_ =
                                               (undefined1)(uVar5 >> 0x18);
                                          iVar28 = ptls_buffer__do_pushv
                                                             (emitter->buf,&ticket_server_name,4);
                                          if (iVar28 == 0) {
                                            uVar42 = emitter->buf->off - sVar65;
                                            for (lVar46 = 8; lVar46 != -8; lVar46 = lVar46 + -8) {
                                              emitter->buf->base[sVar65 - 2] =
                                                   (uint8_t)(uVar42 >> ((byte)lVar46 & 0x3f));
                                              sVar65 = sVar65 + 1;
                                            }
                                            sVar65 = emitter->buf->off;
                                            goto LAB_001154cd;
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      if (tls->state != PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA) {
        __assert_fail("tls->state == PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/lib/picotls.c"
                      ,0x58a,"int send_session_ticket(ptls_t *, ptls_message_emitter_t *)");
      }
      ppVar34 = tls->key_schedule;
      issue_at._0_1_ = 5;
      iVar28 = ptls_buffer__do_pushv(ppVar63,&issue_at,1);
      if ((iVar28 == 0) && (iVar28 = ptls_buffer__do_pushv(ppVar63,"",3), iVar28 == 0)) {
        sVar59 = ppVar63->off;
        for (lVar46 = -3; lVar46 != 0; lVar46 = lVar46 + 1) {
          ppVar63->base[lVar46 + sVar59] = '\0';
        }
        if (ppVar34 != (ptls_key_schedule_t *)0x0) {
          ptls__key_schedule_update_hash(ppVar34,ppVar63->base + sVar51,ppVar63->off - sVar51);
        }
        ppVar63 = emitter->buf;
        ppVar63->off = sVar51;
        goto LAB_00114ece;
      }
    }
LAB_0011554b:
    ptls_buffer_dispose((ptls_buffer_t *)binder_key);
    psVar15 = tls->key_schedule->hashes[0].ctx;
    (*psVar15->final)(psVar15,(void *)0x0,PTLS_HASH_FINAL_MODE_FREE);
    tls->key_schedule->hashes[0].ctx = psVar40;
    if (iVar28 != 0) goto LAB_0011260a;
    ppVar41 = tls->ctx;
  }
  iVar28 = 0x202;
  if ((ppVar41->field_0x70 & 8) == 0) {
    iVar28 = 0;
  }
LAB_0011260a:
  free(pubkey.base);
  if (ecdh_secret.base != (uint8_t *)0x0) {
    (*ptls_clear_memory)(ecdh_secret.base,ecdh_secret.len);
    free(ecdh_secret.base);
  }
  return iVar28;
}

Assistant:

static int server_handle_hello(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_iovec_t message,
                               ptls_handshake_properties_t *properties)
{
#define EMIT_SERVER_HELLO(sched, fill_rand, extensions)                                                                            \
    ptls_push_message(emitter, (sched), PTLS_HANDSHAKE_TYPE_SERVER_HELLO, {                                                        \
        ptls_buffer_push16(emitter->buf, 0x0303 /* legacy version */);                                                             \
        if ((ret = ptls_buffer_reserve(emitter->buf, PTLS_HELLO_RANDOM_SIZE)) != 0)                                                \
            goto Exit;                                                                                                             \
        do {                                                                                                                       \
            fill_rand                                                                                                              \
        } while (0);                                                                                                               \
        emitter->buf->off += PTLS_HELLO_RANDOM_SIZE;                                                                               \
        ptls_buffer_push_block(emitter->buf, 1,                                                                                    \
                               { ptls_buffer_pushv(emitter->buf, ch.legacy_session_id.base, ch.legacy_session_id.len); });         \
        ptls_buffer_push16(emitter->buf, tls->cipher_suite->id);                                                                   \
        ptls_buffer_push(emitter->buf, 0);                                                                                         \
        ptls_buffer_push_block(emitter->buf, 2, {                                                                                  \
            buffer_push_extension(emitter->buf, PTLS_EXTENSION_TYPE_SUPPORTED_VERSIONS,                                            \
                                  { ptls_buffer_push16(emitter->buf, ch.selected_version); });                                     \
            do {                                                                                                                   \
                extensions                                                                                                         \
            } while (0);                                                                                                           \
        });                                                                                                                        \
    }